

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  Transform *this_00;
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pLVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  SampledWavelengths *pSVar49;
  uint uVar50;
  undefined4 extraout_var;
  ulong uVar51;
  ulong uVar52;
  byte bVar53;
  ulong uVar54;
  DebugMLTSampler *this_01;
  DenselySampledSpectrum *this_02;
  int iVar55;
  int iVar56;
  ImageInfiniteLight *this_03;
  int iVar57;
  size_t *psVar58;
  int iVar59;
  long lVar60;
  float *pfVar61;
  int *piVar62;
  int *piVar63;
  int iVar64;
  float *pfVar65;
  pointer pLVar66;
  Interval<float> *pIVar67;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar68;
  PrimitiveHandle *this_04;
  long in_FS_OFFSET;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  Float FVar77;
  float fVar78;
  Interval<float> IVar79;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> i_05;
  Interval<float> i_06;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar129 [56];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar128 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar130;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float afVar137 [4];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  array<float,_4> aVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar170 [56];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined4 uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  Float t1;
  undefined1 auVar232 [64];
  float fVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  float fVar250;
  undefined1 in_ZMM17 [64];
  undefined1 in_XMM18 [16];
  Vector3f woRender;
  SampledSpectrum SVar251;
  bool terminated;
  bool scattered;
  int voxel [3];
  float deltaT [3];
  float nextCrossingT [3];
  int numScatters;
  int voxelLimit [3];
  int step [3];
  BSDF bsdf;
  SampledSpectrum beta;
  optional<pbrt::ShapeIntersection> si;
  bool local_45e;
  bool local_45d;
  float local_45c;
  float local_458 [3];
  float local_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  array<float,_4> local_438;
  int local_424 [3];
  float local_418 [4];
  undefined8 local_408;
  float local_400;
  undefined8 local_3fc;
  float local_3f4;
  Tuple3<pbrt::Point3,_float> local_3e8;
  Point3fi local_3d8;
  int local_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  SimpleVolPathIntegrator *local_380;
  Interval<float> *local_378;
  int local_370 [4];
  int local_360;
  int local_35c;
  SampledWavelengths *local_358;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  SampledSpectrum local_308;
  undefined1 local_2f0 [32];
  int *local_2d0;
  SimpleVolPathIntegrator *local_2c8;
  SampledSpectrum *local_2c0;
  RayDifferential *local_2b8;
  bool *local_2b0;
  undefined1 local_2a8 [8];
  Interval<float> IStack_2a0;
  Interval<float> local_298 [9];
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  bool local_210;
  SampledSpectrum local_208;
  PrimitiveHandle *local_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  SampledSpectrum local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  ScratchBuffer *local_150;
  Interval<float> local_148;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_140;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  undefined8 local_38;
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  
  local_3bc = 0;
  local_308.values.values[0] = 0.0;
  local_308.values.values[1] = 0.0;
  local_308.values.values[2] = 0.0;
  local_308.values.values[3] = 0.0;
  local_1c8.values.values[0] = 1.0;
  local_1c8.values.values[1] = 1.0;
  local_1c8.values.values[2] = 1.0;
  local_1c8.values.values[3] = 1.0;
  if (((((lambda->pdf).values[1] != 0.0) || (fVar78 = (lambda->pdf).values[2], fVar78 != 0.0)) ||
      (NAN(fVar78))) || ((fVar78 = (lambda->pdf).values[3], fVar78 != 0.0 || (NAN(fVar78))))) {
    (lambda->pdf).values[3] = 0.0;
    (lambda->pdf).values[1] = 0.0;
    (lambda->pdf).values[2] = 0.0;
    (lambda->pdf).values[0] = (lambda->pdf).values[0] * 0.25;
  }
  this_04 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_380 = this;
  local_378 = (Interval<float> *)sampler;
  local_358 = lambda;
  local_1f0 = this_04;
  local_150 = scratchBuffer;
LAB_004439f6:
  *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
  if (((this_04->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits & 0xffffffffffff) == 0) {
    local_138._0_64_ = ZEXT1664(ZEXT816(0) << 0x40);
    local_38 = 0;
    local_138._64_64_ = local_138._0_64_;
    local_138._128_64_ = local_138._0_64_;
    local_138._192_64_ = local_138._0_64_;
  }
  else {
    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_138.__align,this_04,&ray->super_Ray,
               INFINITY);
  }
  pIVar67 = local_378;
  local_45d = false;
  local_45e = false;
  if (((ray->super_Ray).medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits & 0xffffffffffff) != 0) {
    _local_448 = ZEXT416((uint)((byte)local_38 & 1) * local_138._248_4_ +
                         (uint)!(bool)((byte)local_38 & 1) * 0x7f800000);
    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
    local_2a8 = (undefined1  [8])*local_378;
    FVar77 = detail::DispatchSplit<8>::operator()
                       ((DispatchSplit<8> *)local_2f0,local_2a8,(ulong)*local_378 >> 0x30);
    local_3a8._0_4_ = FVar77;
    local_2a8 = (undefined1  [8])*pIVar67;
    FVar77 = detail::DispatchSplit<8>::operator()
                       ((DispatchSplit<8> *)local_2f0,local_2a8,(ulong)*pIVar67 >> 0x30);
    pSVar49 = local_358;
    auVar72 = in_ZMM17._0_16_;
    uVar51 = (CONCAT44(extraout_var,local_3a8._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar51 = (uVar51 >> 0x2f ^ uVar51) * -0x395b586ca42e166b;
    uVar52 = uVar51 >> 0x2f ^ uVar51;
    uVar51 = (CONCAT44((int)(uVar51 >> 0x20),FVar77) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar54 = (uVar51 >> 0x2f ^ uVar51) * -0x395b586ca42e166b;
    local_3a8 = (undefined1  [8])(uVar52 * 2 + 1);
    uVar51 = (ray->super_Ray).medium.
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             .bits;
    this_02 = (DenselySampledSpectrum *)(uVar51 & 0xffffffffffff);
    local_3b8._0_8_ =
         ((uVar54 >> 0x2f ^ uVar54) + 1) * 0x5851f42d4c957f2d + uVar52 * -0x4f5c17a566d501a4 + 1;
    this_00 = (Transform *)(this_02 + 3);
    auVar170 = (undefined1  [56])0x0;
    local_2b8 = ray;
    if (0x2ffffffffffff < uVar51) {
      if ((uVar51 & 0xfffe000000000000) == 0x2000000000000) {
        local_338._0_8_ = uVar51;
        local_2f0._8_8_ = &local_308;
        local_2f0._0_8_ = local_378;
        local_2f0._24_8_ = &local_45e;
        local_2f0._16_8_ = local_358;
        local_2d0 = &local_3bc;
        local_2b0 = &local_45d;
        local_2c0 = &local_1c8;
        local_2c8 = local_380;
        uVar3._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar3._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = uVar3;
        fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_400 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        local_408._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        local_408._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar172._0_4_ = (float)(undefined4)uVar3 * (float)(undefined4)uVar3;
        auVar172._4_4_ = (float)uVar3._4_4_ * (float)uVar3._4_4_;
        auVar172._8_8_ = 0;
        auVar73 = vmovshdup_avx(auVar172);
        auVar73 = vfmadd231ss_fma(auVar73,auVar133,auVar133);
        auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        auVar73 = vsqrtss_avx(auVar73,auVar73);
        fVar130 = auVar73._0_4_;
        local_45c = fVar130 * (float)local_448._0_4_;
        auVar198._4_4_ = fVar130;
        auVar198._0_4_ = fVar130;
        auVar198._8_4_ = fVar130;
        auVar198._12_4_ = fVar130;
        local_448._0_4_ = fVar78 / fVar130;
        register0x00001204 = SUB6012((undefined1  [60])0x0,0);
        auVar73 = vdivps_avx(auVar133,auVar198);
        uVar2 = vmovlps_avx(auVar73);
        auVar80._4_4_ = (undefined4)local_408;
        auVar80._0_4_ = (undefined4)local_408;
        auVar80._8_4_ = (undefined4)local_408;
        auVar80._12_4_ = (undefined4)local_408;
        auVar134._4_4_ = local_408._4_4_;
        auVar134._0_4_ = local_408._4_4_;
        auVar134._8_4_ = local_408._4_4_;
        auVar134._12_4_ = local_408._4_4_;
        local_3fc._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_3d8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar80,auVar134);
        auVar135._4_4_ = local_400;
        auVar135._0_4_ = local_400;
        auVar135._8_4_ = local_400;
        auVar135._12_4_ = local_400;
        local_418[1] = local_3fc._4_4_;
        local_418[0] = local_3fc._4_4_;
        local_418[2] = local_3fc._4_4_;
        local_418[3] = local_3fc._4_4_;
        local_3d8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar135);
        local_3fc._0_4_ = (float)uVar2;
        local_438.values[1] = (float)local_3fc;
        local_438.values[0] = (float)local_3fc;
        local_438.values[2] = (float)local_3fc;
        local_438.values[3] = (float)local_3fc;
        local_3fc = uVar2;
        local_3f4 = (float)local_448._0_4_;
        Transform::operator()((Point3fi *)local_2a8,this_00,&local_3d8);
        auVar73 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_max),
                                ZEXT416(*(uint *)((long)&this_02[3].values.ptr + 4)),0x10);
        auVar74 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_min),
                                ZEXT416(*(uint *)&this_02[3].values.ptr),0x10);
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource),
                                ZEXT416((uint)this_02[3].values.nAlloc),0x10);
        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_418[0] *
                                                 *(float *)((long)&this_02[3].values.nStored + 4))),
                                   (undefined1  [16])local_438.values,
                                   ZEXT416((uint)this_02[3].values.nStored));
        local_398 = vfmadd231ss_fma(auVar131,_local_448,ZEXT416((uint)this_02[4].lambda_min));
        auVar136._0_4_ = local_418[0] * auVar73._0_4_;
        auVar136._4_4_ = local_418[1] * auVar73._4_4_;
        auVar136._8_4_ = local_418[2] * auVar73._8_4_;
        auVar136._12_4_ = local_418[3] * auVar73._12_4_;
        uVar171 = local_448._0_4_;
        auVar235._4_4_ = uVar171;
        auVar235._0_4_ = uVar171;
        auVar235._8_4_ = uVar171;
        auVar235._12_4_ = uVar171;
        auVar73 = vfmadd213ps_fma(auVar74,(undefined1  [16])local_438.values,auVar136);
        local_348 = vfmadd213ps_fma(auVar235,auVar75,auVar73);
        local_328 = vmovshdup_avx(local_348);
        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_328._0_4_ * local_328._0_4_)),local_348,
                                  local_348);
        auVar73 = vfmadd231ss_fma(auVar73,local_398,local_398);
        if (auVar73._0_4_ <= 0.0) {
          auVar88._8_8_ = 0;
          auVar88._0_4_ = local_298[0].low;
          auVar88._4_4_ = local_298[0].high;
          fVar78 = local_45c;
        }
        else {
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(local_328,auVar187);
          auVar75 = vandps_avx(local_348,auVar187);
          auVar131 = vandps_avx(local_398,auVar187);
          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar75)
          ;
          auVar74 = vfmadd231ss_fma(auVar74,ZEXT816(0) << 0x20,auVar131);
          fVar130 = auVar74._0_4_ / auVar73._0_4_;
          fVar78 = local_348._0_4_ * fVar130;
          local_448._0_4_ = fVar130;
          i_01.high = fVar78;
          i_01.low = fVar78;
          local_438.values = (float  [4])ZEXT416((uint)(local_398._0_4_ * fVar130));
          auVar97._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_2a8,i_01);
          auVar97._8_56_ = extraout_var_05;
          uVar2 = vmovlps_avx(auVar97._0_16_);
          local_2a8 = (undefined1  [8])uVar2;
          i_02.high = (float)local_448._0_4_ * (float)local_328._0_4_;
          i_02.low = (float)local_448._0_4_ * (float)local_328._0_4_;
          auVar98._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_2a8 + 8),i_02)
          ;
          auVar98._8_56_ = extraout_var_06;
          uVar2 = vmovlps_avx(auVar98._0_16_);
          IStack_2a0 = (Interval<float>)uVar2;
          i_03.high = local_438.values[0];
          i_03.low = local_438.values[0];
          auVar99._0_8_ = Interval<float>::operator+<float>(local_298,i_03);
          auVar99._8_56_ = extraout_var_07;
          auVar88 = auVar99._0_16_;
          fVar78 = local_45c - (float)local_448._0_4_;
        }
        pSVar49 = local_358;
        auVar232 = ZEXT464((uint)fVar78);
        auVar75 = SUB6416(ZEXT464(0x3f800003),0);
        auVar73 = vhaddps_avx(auVar88,auVar88);
        local_44c = auVar73._0_4_ * 0.5;
        auVar72 = vxorps_avx512vl(auVar72,auVar72);
        in_ZMM17 = ZEXT1664(auVar72);
        bVar70 = false;
        uVar50 = 0;
        auVar72 = vinsertps_avx(_local_2a8,ZEXT416((uint)IStack_2a0.high),0x10);
        fVar78 = 1.0 / local_328._0_4_;
        auVar146._0_4_ = local_2a8._4_4_ + auVar72._0_4_;
        auVar146._4_4_ = local_2a8._8_4_ + auVar72._4_4_;
        auVar146._8_4_ = auVar72._8_4_ + 0.0;
        auVar146._12_4_ = auVar72._12_4_ + 0.0;
        auVar30._8_4_ = 0x3f000000;
        auVar30._0_8_ = 0x3f0000003f000000;
        auVar30._12_4_ = 0x3f000000;
        auVar72 = vmulps_avx512vl(auVar146,auVar30);
        fVar130 = 1.0 / local_348._0_4_;
        fVar195 = 1.0 / local_398._0_4_;
        in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar195));
        auVar73 = vmovshdup_avx512vl(auVar72);
        auVar74 = vsubss_avx512f(ZEXT416(*(uint *)((long)&(this_02->values).alloc.memoryResource + 4
                                                  )),auVar73);
        auVar170 = (undefined1  [56])0x0;
        do {
          auVar131 = ZEXT416((uint)(fVar130 *
                                   (*(float *)&(this_02->values).alloc.memoryResource -
                                   auVar72._0_4_)));
          bVar69 = false;
          bVar71 = uVar50 == 0;
          psVar58 = (size_t *)((long)&(this_02->values).ptr + 4);
          fVar196 = fVar130;
          fVar233 = auVar72._0_4_;
          if (!bVar71) {
            auVar131 = ZEXT416((uint)(fVar78 * auVar74._0_4_));
            bVar69 = uVar50 == 0;
            bVar71 = uVar50 == 1;
            psVar58 = &(this_02->values).nAlloc;
            fVar196 = fVar78;
            fVar233 = auVar73._0_4_;
            if (!bVar71) {
              auVar131 = ZEXT416((uint)(fVar195 * (*(float *)&(this_02->values).ptr - local_44c)));
              psVar58 = (size_t *)((long)&(this_02->values).nAlloc + 4);
              fVar196 = fVar195;
              fVar233 = local_44c;
            }
          }
          auVar76 = ZEXT416((uint)((*(float *)psVar58 - fVar233) * fVar196));
          auVar132 = vminss_avx(auVar76,auVar131);
          auVar131 = vmaxss_avx(auVar131,auVar76);
          vmaxss_avx512f(auVar132,in_ZMM17._0_16_);
          auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 1.0000004)),auVar232._0_16_);
          auVar232 = ZEXT1664(auVar131);
          afVar137 = (float  [4])vucomiss_avx512f(auVar131);
          in_ZMM17 = ZEXT1664((undefined1  [16])afVar137);
          if (!bVar69 && !bVar71) {
            this_04 = local_1f0;
            if (!bVar70) goto LAB_00446a00;
            break;
          }
          bVar70 = 1 < uVar50;
          uVar50 = uVar50 + 1;
        } while (uVar50 != 3);
        uVar171 = (undefined4)this_02[2].values.nStored;
        local_448._4_4_ = uVar171;
        local_448._0_4_ = uVar171;
        fStack_440 = (float)uVar171;
        fStack_43c = (float)uVar171;
        auVar129 = ZEXT856(local_448._8_8_);
        local_45c = auVar131._0_4_;
        local_438.values = afVar137;
        _local_1e8 = auVar72;
        _local_198 = auVar73;
        SVar251 = DenselySampledSpectrum::Sample
                            ((DenselySampledSpectrum *)&(this_02->values).nStored,local_358);
        auVar159._0_8_ = SVar251.values.values._8_8_;
        auVar159._8_56_ = auVar170;
        auVar110._0_8_ = SVar251.values.values._0_8_;
        auVar110._8_56_ = auVar129;
        auVar72 = vmovlhps_avx(auVar110._0_16_,auVar159._0_16_);
        local_1d8._4_4_ = auVar72._4_4_ * (float)local_448._4_4_;
        local_1d8._0_4_ = auVar72._0_4_ * (float)local_448._0_4_;
        fStack_1d0 = auVar72._8_4_ * fStack_440;
        fStack_1cc = auVar72._12_4_ * fStack_43c;
        uVar171 = (undefined4)this_02[2].values.nStored;
        local_448._4_4_ = uVar171;
        local_448._0_4_ = uVar171;
        fStack_440 = (float)uVar171;
        fStack_43c = (float)uVar171;
        auVar129 = ZEXT856(local_448._8_8_);
        SVar251 = DenselySampledSpectrum::Sample
                            ((DenselySampledSpectrum *)&this_02[1].values.nStored,pSVar49);
        auVar160._0_8_ = SVar251.values.values._8_8_;
        auVar160._8_56_ = auVar170;
        auVar111._0_8_ = SVar251.values.values._0_8_;
        auVar111._8_56_ = auVar129;
        fVar78 = *(float *)&(this_02->values).ptr;
        auVar74 = vpcmpeqd_avx(auVar75,auVar75);
        auVar197 = ZEXT816(0) << 0x40;
        lVar60 = 0;
        fVar195 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar78;
        auVar211._0_4_ = local_398._0_4_ / fVar195;
        auVar211._4_12_ = local_398._4_12_;
        local_458[1] = auVar211._0_4_;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = (this_02->values).alloc.memoryResource;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = *(ulong *)((long)&(this_02->values).ptr + 4);
        iVar55 = *(int *)&this_02[10].values.ptr;
        auVar73 = vsubps_avx(auVar192,auVar179);
        auVar72 = vsubps_avx(_local_1e8,auVar179);
        auVar72 = vdivps_avx(auVar72,auVar73);
        auVar73 = vdivps_avx(local_348,auVar73);
        auVar75 = vbroadcastss_avx512vl((undefined1  [16])local_438.values);
        local_458[2] = auVar73._0_4_;
        local_458[0] = (float)vextractps_avx(auVar73,1);
        auVar180._0_4_ = auVar72._0_4_ + auVar75._0_4_ * auVar73._0_4_;
        auVar180._4_4_ = auVar72._4_4_ + auVar75._4_4_ * auVar73._4_4_;
        auVar180._8_4_ = auVar72._8_4_ + auVar75._8_4_ * auVar73._8_4_;
        auVar180._12_4_ = auVar72._12_4_ + auVar75._12_4_ * auVar73._12_4_;
        auVar75 = vmovshdup_avx(auVar180);
        auVar232 = ZEXT1664(auVar75);
        auVar218._8_8_ = 0;
        auVar218._0_8_ = this_02[10].values.alloc.memoryResource;
        auVar72 = vcvtdq2ps_avx(auVar218);
        auVar73 = vpaddd_avx(auVar74,auVar218);
        auVar73 = vcvtdq2ps_avx(auVar73);
        fVar130 = auVar72._0_4_;
        auVar225._0_4_ = auVar180._0_4_ * fVar130;
        auVar225._4_4_ = auVar180._4_4_ * auVar72._4_4_;
        auVar225._8_4_ = auVar180._8_4_ * auVar72._8_4_;
        auVar225._12_4_ = auVar180._12_4_ * auVar72._12_4_;
        auVar131 = vmovshdup_avx(auVar73);
        uVar51 = vcmpps_avx512vl(auVar73,auVar225,1);
        auVar132 = vmovshdup_avx(auVar225);
        uVar2 = vcmpss_avx512f(auVar132,auVar197,1);
        bVar53 = (byte)(uVar51 >> 1);
        auVar74 = vmovlhps_avx(auVar111._0_16_,auVar160._0_16_);
        local_1a8._0_4_ = auVar74._0_4_ * (float)local_448._0_4_;
        local_1a8._4_4_ = auVar74._4_4_ * (float)local_448._4_4_;
        fStack_1a0 = auVar74._8_4_ * fStack_440;
        fStack_19c = auVar74._12_4_ * fStack_43c;
        auVar76 = vmulss_avx512f((undefined1  [16])local_438.values,auVar211);
        auVar74 = vmovshdup_avx(auVar72);
        local_1b8 = vaddps_avx512vl(_local_1a8,_local_1d8);
        auVar249 = ZEXT1664(local_1b8);
        fVar78 = (local_44c - fVar78) / fVar195 + auVar76._0_4_;
        auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar55);
        uVar9 = vcmpss_avx512f(auVar225,auVar197,1);
        auVar76 = vcvtsi2ss_avx512f(in_XMM18,iVar55 + -1);
        iVar55 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) *
                             ((uint)(bVar53 & 1) * auVar131._0_4_ +
                             (uint)!(bool)(bVar53 & 1) * auVar132._0_4_));
        iVar56 = (int)(float)((uint)!(bool)((byte)uVar9 & 1) *
                             ((uint)((byte)uVar51 & 1) * auVar73._0_4_ +
                             (uint)!(bool)((byte)uVar51 & 1) * (int)auVar225._0_4_));
        fVar195 = auVar72._0_4_;
        auVar72 = vminss_avx(auVar76,ZEXT416((uint)(fVar78 * fVar195)));
        uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar78 * fVar195)),auVar197,1);
        iVar57 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) * auVar72._0_4_);
        fVar196 = auVar74._0_4_;
        do {
          pfVar61 = local_458 + 2;
          iVar59 = (int)lVar60;
          if (iVar59 != 0) {
            if (iVar59 == 1) {
              pfVar61 = local_458;
            }
            else {
              pfVar61 = local_458 + 1;
            }
          }
          if ((*pfVar61 == 0.0) && (!NAN(*pfVar61))) {
            pfVar61 = local_458 + 2;
            if (iVar59 != 0) {
              if (iVar59 == 1) {
                pfVar61 = local_458;
              }
              else {
                pfVar61 = local_458 + 1;
              }
            }
            *pfVar61 = 0.0;
          }
          if (iVar59 == 1) {
            local_424[1] = iVar55;
            piVar62 = local_370 + 1;
            piVar63 = local_370 + 4;
            pfVar61 = (float *)((long)&local_408 + 4);
            pIVar67 = (Interval<float> *)
                      &local_3d8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            pfVar65 = local_458;
            iVar64 = iVar55;
          }
          else if (iVar59 == 0) {
            local_424[lVar60] = iVar56;
            piVar62 = local_370;
            piVar63 = local_370 + 3;
            pfVar61 = (float *)&local_408;
            pIVar67 = (Interval<float> *)&local_3d8;
            pfVar65 = local_458 + 2;
            iVar64 = iVar56;
          }
          else {
            piVar62 = local_370 + 2;
            piVar63 = local_370 + 5;
            pfVar61 = &local_400;
            pIVar67 = &local_3d8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
            pfVar65 = local_458 + 1;
            local_424[lVar60] = iVar57;
            iVar64 = iVar57;
          }
          if (0.0 <= *pfVar65) {
            auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64 + 1);
            fVar233 = auVar72._0_4_;
            if (iVar59 == 1) {
              auVar241._0_4_ = (fVar233 / fVar196 - auVar75._0_4_) / local_458[0];
              auVar241._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar241);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar196) / local_458[0];
              pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&this_02[10].values.alloc.memoryResource + 4);
            }
            else if (iVar59 == 0) {
              auVar240._0_4_ = (fVar233 / fVar130 - auVar180._0_4_) / local_458[2];
              auVar240._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar240);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar130) / local_458[2];
              pvVar68 = &this_02[10].values;
            }
            else {
              auVar242._0_4_ = (fVar233 / fVar195 - fVar78) / local_458[1];
              auVar242._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar242);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar195) / local_458[1];
              pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        &this_02[10].values.ptr;
            }
            *pfVar61 = fVar233;
            *piVar63 = 1;
            iVar59 = *(int *)&(pvVar68->alloc).memoryResource;
          }
          else {
            auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64);
            fVar233 = auVar72._0_4_;
            if (iVar59 == 1) {
              auVar72 = ZEXT416((uint)(fVar233 / fVar196 - auVar75._0_4_));
              fVar233 = local_458[0];
              fVar250 = -(1.0 / fVar196);
            }
            else if (iVar59 == 0) {
              auVar72 = ZEXT416((uint)(fVar233 / fVar130 - auVar180._0_4_));
              fVar233 = local_458[2];
              fVar250 = -(1.0 / fVar130);
            }
            else {
              auVar72 = ZEXT416((uint)(fVar233 / fVar195 - fVar78));
              fVar233 = local_458[1];
              fVar250 = -(1.0 / fVar195);
            }
            auVar247._0_4_ = auVar72._0_4_ / fVar233;
            auVar247._4_12_ = auVar72._4_12_;
            auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar247);
            *piVar63 = -1;
            iVar59 = -1;
            (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
            *pfVar61 = fVar250 / fVar233;
          }
          lVar60 = lVar60 + 1;
          *piVar62 = iVar59;
        } while (lVar60 != 3);
        uVar51 = local_3b8._0_8_ * 0x5851f42d4c957f2d + (long)local_3a8;
        uVar50 = local_3b8._4_4_ >> 0xd ^ (uint)((ulong)local_3b8._0_8_ >> 0x1b);
        bVar53 = local_3b8[7] >> 3;
        auVar72 = vcvtusi2ss_avx512f(in_XMM18,uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
        local_338._0_8_ = local_338._0_8_ | 0x3000000000000;
        auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        in_ZMM4 = ZEXT1664(auVar72);
        aVar145.values = local_438.values;
        fVar78 = local_45c;
        while( true ) {
          in_ZMM17 = ZEXT1664((undefined1  [16])aVar145.values);
          lVar60 = (long)*(int *)(&DAT_0061fea0 +
                                 (ulong)((uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
                                                .high < local_3d8.
                                                        super_Point3<pbrt::Interval<float>_>.
                                                                                                                
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                        (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                               low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                        (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                               low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
          fVar130 = (&local_3d8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60];
          uVar171 = *(undefined4 *)
                     (this_02[9].values.nAlloc +
                     (((long)local_424[2] *
                       (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                      (long)local_424[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource +
                     (long)local_424[0]) * 4);
          auVar31._4_4_ = uVar171;
          auVar31._0_4_ = uVar171;
          auVar31._8_4_ = uVar171;
          auVar31._12_4_ = uVar171;
          auVar72 = vmulps_avx512vl(auVar249._0_16_,auVar31);
          if (0.0 < auVar72._0_4_) {
            local_318._0_4_ = fVar130;
            local_418[0] = in_ZMM4._0_4_;
            local_178 = auVar72._0_8_ ^ 0x8000000080000000;
            fStack_170 = (float)(auVar72._8_4_ ^ 0x80000000);
            fStack_16c = (float)(auVar72._12_4_ ^ 0x80000000);
            auVar73 = vsubss_avx512f(ZEXT416((uint)fVar130),(undefined1  [16])aVar145.values);
            local_438.values = aVar145.values;
            local_3b8 = auVar72;
            fVar78 = expf(auVar73._0_4_ * -auVar72._0_4_);
            fVar78 = 1.0 - fVar78;
            if (local_418[0] < fVar78) {
              auVar249 = ZEXT1664((undefined1  [16])local_438.values);
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              _local_188 = vxorps_avx512vl(local_3b8,auVar32);
              uVar52 = uVar51;
              do {
                local_438.values = auVar249._0_16_;
                fVar78 = logf(1.0 - local_418[0]);
                fVar78 = local_438.values[0] - fVar78 / (float)local_3b8._0_4_;
                in_ZMM4 = ZEXT464((uint)fVar78);
                if (local_45c <= fVar78) goto LAB_004469ae;
                local_448._0_4_ = fVar78;
                auVar72 = vinsertps_avx(ZEXT416((uint)(fVar78 * (float)local_348._0_4_ +
                                                      (float)local_1e8._0_4_)),
                                        ZEXT416((uint)(fVar78 * (float)local_328._0_4_ +
                                                      (float)local_198._0_4_)),0x10);
                local_3e8.z = fVar78 * (float)local_398._0_4_ + local_44c;
                auVar181._8_4_ = 0x3da1d5b6;
                auVar181._0_8_ = 0x3da1d5b63da1d5b6;
                auVar181._12_4_ = 0x3da1d5b6;
                local_3e8._0_8_ = vmovlps_avx(auVar72);
                fVar78 = fVar78 - local_438.values[0];
                auVar89._0_4_ = fVar78 * (float)local_188._0_4_;
                auVar89._4_4_ = fVar78 * (float)local_188._4_4_;
                auVar89._8_4_ = fVar78 * fStack_180;
                auVar89._12_4_ = fVar78 * fStack_17c;
                auVar33._8_4_ = 0x3fb8aa3b;
                auVar33._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar33._12_4_ = 0x3fb8aa3b;
                auVar73 = vmulps_avx512vl(auVar89,auVar33);
                auVar72 = vroundps_avx(auVar73,9);
                auVar73 = vsubps_avx(auVar73,auVar72);
                auVar34._8_4_ = 0x3e658299;
                auVar34._0_8_ = 0x3e6582993e658299;
                auVar34._12_4_ = 0x3e658299;
                auVar74 = vfmadd213ps_avx512vl(auVar181,auVar73,auVar34);
                auVar147._0_4_ = (int)auVar72._0_4_;
                auVar147._4_4_ = (int)auVar72._4_4_;
                auVar147._8_4_ = (int)auVar72._8_4_;
                auVar147._12_4_ = (int)auVar72._12_4_;
                auVar129 = ZEXT856(auVar147._8_8_);
                auVar35._8_4_ = 0xffffffe1;
                auVar35._0_8_ = 0xffffffe1ffffffe1;
                auVar35._12_4_ = 0xffffffe1;
                uVar51 = vpcmpgtd_avx512vl(auVar147,auVar35);
                uVar51 = uVar51 & 0xf;
                auVar36._8_4_ = 0x1e;
                auVar36._0_8_ = 0x1e0000001e;
                auVar36._12_4_ = 0x1e;
                uVar54 = vpcmpgtd_avx512vl(auVar147,auVar36);
                uVar54 = uVar54 & 0xf;
                auVar37._8_4_ = 0x3f3263b7;
                auVar37._0_8_ = 0x3f3263b73f3263b7;
                auVar37._12_4_ = 0x3f3263b7;
                auVar72 = vfmadd213ps_avx512vl(auVar74,auVar73,auVar37);
                auVar38._8_4_ = 0x3f7ff3bf;
                auVar38._0_8_ = 0x3f7ff3bf3f7ff3bf;
                auVar38._12_4_ = 0x3f7ff3bf;
                auVar72 = vfmadd213ps_avx512vl(auVar72,auVar73,auVar38);
                auVar73 = vpslld_avx(auVar147,0x17);
                auVar72 = vpaddd_avx(auVar73,auVar72);
                auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar70 = (bool)((byte)uVar54 & 1);
                local_438.values[0] =
                     (float)((uint)bVar70 * auVar73._0_4_ |
                            (uint)!bVar70 * (uint)((byte)uVar51 & 1) * auVar72._0_4_);
                bVar70 = (bool)((byte)(uVar54 >> 1) & 1);
                local_438.values[1] =
                     (float)((uint)bVar70 * auVar73._4_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_);
                bVar70 = (bool)((byte)(uVar54 >> 2) & 1);
                local_438.values[2] =
                     (float)((uint)bVar70 * auVar73._8_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_);
                bVar70 = SUB81(uVar54 >> 3,0);
                local_438.values[3] =
                     (float)((uint)bVar70 * auVar73._12_4_ |
                            (uint)!bVar70 * (uint)(byte)(uVar51 >> 3) * auVar72._12_4_);
                auVar170 = ZEXT856(local_438.values._8_8_);
                SVar251 = CloudMediumProvider::Density
                                    (*(CloudMediumProvider **)this_02,(Point3f *)&local_3e8,
                                     local_358);
                auVar132 = local_338;
                auVar161._0_8_ = SVar251.values.values._8_8_;
                auVar161._8_56_ = auVar129;
                auVar112._0_8_ = SVar251.values.values._0_8_;
                auVar112._8_56_ = auVar170;
                auVar73 = vmovlhps_avx(auVar112._0_16_,auVar161._0_16_);
                fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                local_298[1].low = (ray->super_Ray).time;
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                        *(float *)((long)&this_02[7].values.ptr + 4)
                                                        )),ZEXT416((uint)local_3e8.x),
                                          ZEXT416(*(uint *)&this_02[7].values.ptr));
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y * (float)this_02[7].lambda_max)
                                                 ),ZEXT416((uint)local_3e8.x),
                                          ZEXT416((uint)this_02[7].lambda_min));
                auVar75 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                        *(float *)((long)&this_02[6].values.alloc.
                                                                          memoryResource + 4))),
                                          ZEXT416((uint)local_3e8.x),
                                          ZEXT416(*(uint *)&this_02[6].values.alloc.memoryResource))
                ;
                auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                         *(float *)((long)&this_02[6].values.nAlloc
                                                                   + 4))),ZEXT416((uint)local_3e8.x)
                                           ,ZEXT416((uint)this_02[6].values.nAlloc));
                auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)local_3e8.z),
                                          ZEXT416((uint)this_02[7].values.nAlloc));
                auVar74 = vfmadd231ss_fma(auVar74,ZEXT416((uint)local_3e8.z),
                                          ZEXT416(*(uint *)&this_02[7].values.alloc.memoryResource))
                ;
                auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_3e8.z),
                                           ZEXT416((uint)this_02[6].values.nStored));
                auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)local_3e8.z),
                                          ZEXT416(*(uint *)&this_02[6].values.ptr));
                fVar130 = auVar72._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
                fVar195 = auVar74._0_4_ +
                          *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
                fVar196 = auVar131._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
                fVar233 = auVar75._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
                bVar70 = fVar130 == 1.0;
                iVar55 = (uint)bVar70 * (int)fVar195 + (uint)!bVar70 * (int)(fVar195 / fVar130);
                iVar56 = (uint)bVar70 * (int)fVar233 + (uint)!bVar70 * (int)(fVar233 / fVar130);
                auVar205._4_4_ = iVar56;
                auVar205._0_4_ = iVar56;
                auVar205._8_4_ = iVar56;
                auVar205._12_4_ = iVar56;
                iVar56 = (uint)bVar70 * (int)fVar196 + (uint)!bVar70 * (int)(fVar196 / fVar130);
                uVar4._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                uVar4._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar201._8_8_ = 0;
                auVar201._0_8_ = uVar4;
                local_298[5].low = 0.0;
                auVar193._4_4_ = iVar56;
                auVar193._0_4_ = iVar56;
                auVar193._8_4_ = iVar56;
                auVar193._12_4_ = iVar56;
                _local_2a8 = vmovlhps_avx(auVar205,auVar193);
                auVar206._4_4_ = iVar55;
                auVar206._0_4_ = iVar55;
                auVar206._8_4_ = iVar55;
                auVar206._12_4_ = iVar55;
                auVar219._0_4_ = (float)(undefined4)uVar4 * (float)(undefined4)uVar4;
                auVar219._4_4_ = (float)uVar4._4_4_ * (float)uVar4._4_4_;
                auVar219._8_8_ = 0;
                auVar72 = vmovshdup_avx(auVar219);
                auVar72 = vfmadd231ss_fma(auVar72,auVar201,auVar201);
                auVar202._0_8_ = uVar4 ^ 0x8000000080000000;
                auVar202._8_4_ = 0x80000000;
                auVar202._12_4_ = 0x80000000;
                auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                local_298[2].high = auVar72._0_4_;
                auVar220._4_4_ = local_298[2].high;
                auVar220._0_4_ = local_298[2].high;
                auVar220._8_4_ = local_298[2].high;
                auVar220._12_4_ = local_298[2].high;
                local_298[2].high = -fVar78 / local_298[2].high;
                auVar72 = vdivps_avx(auVar202,auVar220);
                in_ZMM4 = ZEXT1664(auVar72);
                local_298._24_16_ = ZEXT416(0) << 0x20;
                local_230 = local_3b8;
                local_210 = true;
                local_298[0] = (Interval<float>)vmovlps_avx(auVar206);
                local_298._12_8_ = vmovlps_avx(auVar72);
                local_298[6].low = 0.0;
                local_298[6].high = 0.0;
                local_298[7].low = (float)local_338._0_4_;
                local_298[7].high = (float)local_338._4_4_;
                fStack_23c = auVar73._4_4_ * (float)local_1a8._4_4_;
                local_240 = auVar73._0_4_ * (float)local_1a8._0_4_;
                fStack_238 = auVar73._8_4_ * fStack_1a0;
                fStack_234 = auVar73._12_4_ * fStack_19c;
                fStack_24c = auVar73._4_4_ * (float)local_1d8._4_4_;
                local_250 = auVar73._0_4_ * (float)local_1d8._0_4_;
                fStack_248 = auVar73._8_4_ * fStack_1d0;
                fStack_244 = auVar73._12_4_ * fStack_1cc;
                local_208.values.values = (array<float,_4>)(array<float,_4>)local_438.values;
                local_338 = auVar132;
                local_298[8] = (Interval<float>)
                               ((ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000);
                local_220 = local_298._24_16_;
                bVar70 = Li::anon_class_72_9_b858679e::operator()
                                   ((anon_class_72_9_b858679e *)local_2f0,(MediumSample *)local_2a8)
                ;
                this_04 = local_1f0;
                if (!bVar70) goto LAB_00446a00;
                uVar51 = uVar52 * 0x5851f42d4c957f2d + (long)local_3a8;
                uVar50 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
                bVar53 = (byte)(uVar52 >> 0x3b);
                auVar72 = vcvtusi2ss_avx512f(auVar232._0_16_,
                                             uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
                auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),
                                     ZEXT416(0x3f7fffff));
                local_418[0] = auVar72._0_4_;
                fVar78 = expf(((float)local_318._0_4_ - (float)local_448._0_4_) *
                              (float)local_178._0_4_);
                auVar249 = ZEXT464((uint)local_448._0_4_);
                fVar78 = 1.0 - fVar78;
                uVar52 = uVar51;
              } while (local_418[0] < fVar78);
            }
            auVar249 = ZEXT1664(local_1b8);
            auVar72 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                 ZEXT416((uint)((local_418[0] - fVar78) / (1.0 - fVar78))));
            in_ZMM4 = ZEXT1664(auVar72);
            fVar78 = local_45c;
            fVar130 = (float)local_318._0_4_;
          }
          aVar145.values = (float  [4])ZEXT416((uint)fVar130);
          this_04 = local_1f0;
          if ((fVar78 < fVar130) ||
             (iVar55 = local_424[lVar60], iVar56 = local_370[lVar60 + 3],
             local_424[lVar60] = iVar55 + iVar56, this_04 = local_1f0,
             iVar55 + iVar56 == local_370[lVar60])) break;
          (&local_3d8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60] =
               fVar130 + *(float *)((long)&local_408 + lVar60 * 4);
        }
      }
      else {
        local_2f0._8_8_ = &local_308;
        local_2f0._0_8_ = local_378;
        local_2f0._24_8_ = &local_45e;
        local_2f0._16_8_ = local_358;
        local_2d0 = &local_3bc;
        local_2b0 = &local_45d;
        local_2c0 = &local_1c8;
        local_2c8 = local_380;
        uVar52._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar52._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar52;
        fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_400 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        local_408._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        local_408._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar175._0_4_ = (float)(undefined4)uVar52 * (float)(undefined4)uVar52;
        auVar175._4_4_ = (float)uVar52._4_4_ * (float)uVar52._4_4_;
        auVar175._8_8_ = 0;
        auVar73 = vmovshdup_avx(auVar175);
        auVar73 = vfmadd231ss_fma(auVar73,auVar139,auVar139);
        auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
        auVar73 = vsqrtss_avx(auVar73,auVar73);
        fVar130 = auVar73._0_4_;
        local_44c = fVar130 * (float)local_448._0_4_;
        auVar200._4_4_ = fVar130;
        auVar200._0_4_ = fVar130;
        auVar200._8_4_ = fVar130;
        auVar200._12_4_ = fVar130;
        local_448._0_4_ = fVar78 / fVar130;
        register0x00001204 = SUB6012((undefined1  [60])0x0,0);
        auVar73 = vdivps_avx(auVar139,auVar200);
        uVar2 = vmovlps_avx(auVar73);
        auVar85._4_4_ = (undefined4)local_408;
        auVar85._0_4_ = (undefined4)local_408;
        auVar85._8_4_ = (undefined4)local_408;
        auVar85._12_4_ = (undefined4)local_408;
        auVar140._4_4_ = local_408._4_4_;
        auVar140._0_4_ = local_408._4_4_;
        auVar140._8_4_ = local_408._4_4_;
        auVar140._12_4_ = local_408._4_4_;
        local_3fc._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_3d8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar85,auVar140);
        auVar141._4_4_ = local_400;
        auVar141._0_4_ = local_400;
        auVar141._8_4_ = local_400;
        auVar141._12_4_ = local_400;
        local_418[1] = local_3fc._4_4_;
        local_418[0] = local_3fc._4_4_;
        local_418[2] = local_3fc._4_4_;
        local_418[3] = local_3fc._4_4_;
        local_3d8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar141);
        local_3fc._0_4_ = (float)uVar2;
        local_438.values[1] = (float)local_3fc;
        local_438.values[0] = (float)local_3fc;
        local_438.values[2] = (float)local_3fc;
        local_438.values[3] = (float)local_3fc;
        local_3fc = uVar2;
        local_3f4 = (float)local_448._0_4_;
        Transform::operator()((Point3fi *)local_2a8,this_00,&local_3d8);
        auVar73 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_max),
                                ZEXT416(*(uint *)((long)&this_02[3].values.ptr + 4)),0x10);
        auVar74 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_min),
                                ZEXT416(*(uint *)&this_02[3].values.ptr),0x10);
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource),
                                ZEXT416((uint)this_02[3].values.nAlloc),0x10);
        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_418[0] *
                                                 *(float *)((long)&this_02[3].values.nStored + 4))),
                                   (undefined1  [16])local_438.values,
                                   ZEXT416((uint)this_02[3].values.nStored));
        local_348 = vfmadd231ss_fma(auVar131,_local_448,ZEXT416((uint)this_02[4].lambda_min));
        auVar142._0_4_ = local_418[0] * auVar73._0_4_;
        auVar142._4_4_ = local_418[1] * auVar73._4_4_;
        auVar142._8_4_ = local_418[2] * auVar73._8_4_;
        auVar142._12_4_ = local_418[3] * auVar73._12_4_;
        uVar171 = local_448._0_4_;
        auVar236._4_4_ = uVar171;
        auVar236._0_4_ = uVar171;
        auVar236._8_4_ = uVar171;
        auVar236._12_4_ = uVar171;
        auVar73 = vfmadd213ps_fma(auVar74,(undefined1  [16])local_438.values,auVar142);
        local_318 = vfmadd213ps_fma(auVar236,auVar75,auVar73);
        local_398 = vmovshdup_avx(local_318);
        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_398._0_4_ * local_398._0_4_)),local_318,
                                  local_318);
        auVar73 = vfmadd231ss_fma(auVar73,local_348,local_348);
        if (auVar73._0_4_ <= 0.0) {
          auVar90._8_8_ = 0;
          auVar90._0_4_ = local_298[0].low;
          auVar90._4_4_ = local_298[0].high;
          fVar78 = local_44c;
        }
        else {
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(local_398,auVar190);
          auVar75 = vandps_avx(local_318,auVar190);
          auVar131 = vandps_avx(local_348,auVar190);
          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar75)
          ;
          auVar74 = vfmadd231ss_fma(auVar74,ZEXT816(0) << 0x20,auVar131);
          fVar130 = auVar74._0_4_ / auVar73._0_4_;
          fVar78 = local_318._0_4_ * fVar130;
          local_448._0_4_ = fVar130;
          i_04.high = fVar78;
          i_04.low = fVar78;
          local_438.values = (float  [4])ZEXT416((uint)(local_348._0_4_ * fVar130));
          auVar103._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_2a8,i_04);
          auVar103._8_56_ = extraout_var_08;
          uVar2 = vmovlps_avx(auVar103._0_16_);
          local_2a8 = (undefined1  [8])uVar2;
          i_05.high = (float)local_448._0_4_ * (float)local_398._0_4_;
          i_05.low = (float)local_448._0_4_ * (float)local_398._0_4_;
          auVar104._0_8_ =
               Interval<float>::operator+<float>((Interval<float> *)(local_2a8 + 8),i_05);
          auVar104._8_56_ = extraout_var_09;
          uVar2 = vmovlps_avx(auVar104._0_16_);
          IStack_2a0 = (Interval<float>)uVar2;
          i_06.high = local_438.values[0];
          i_06.low = local_438.values[0];
          auVar105._0_8_ = Interval<float>::operator+<float>(local_298,i_06);
          auVar105._8_56_ = extraout_var_10;
          auVar90 = auVar105._0_16_;
          fVar78 = local_44c - (float)local_448._0_4_;
        }
        pSVar49 = local_358;
        auVar232 = ZEXT464((uint)fVar78);
        auVar75 = SUB6416(ZEXT464(0x3f800003),0);
        auVar73 = vhaddps_avx(auVar90,auVar90);
        fVar78 = auVar73._0_4_ * 0.5;
        auVar72 = vxorps_avx512vl(auVar72,auVar72);
        in_ZMM17 = ZEXT1664(auVar72);
        bVar70 = false;
        uVar50 = 0;
        auVar72 = vinsertps_avx(_local_2a8,ZEXT416((uint)IStack_2a0.high),0x10);
        fVar130 = 1.0 / local_398._0_4_;
        auVar148._0_4_ = local_2a8._4_4_ + auVar72._0_4_;
        auVar148._4_4_ = local_2a8._8_4_ + auVar72._4_4_;
        auVar148._8_4_ = auVar72._8_4_ + 0.0;
        auVar148._12_4_ = auVar72._12_4_ + 0.0;
        auVar39._8_4_ = 0x3f000000;
        auVar39._0_8_ = 0x3f0000003f000000;
        auVar39._12_4_ = 0x3f000000;
        auVar72 = vmulps_avx512vl(auVar148,auVar39);
        fVar195 = 1.0 / local_318._0_4_;
        fVar196 = 1.0 / local_348._0_4_;
        in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar196));
        local_338._0_4_ = fVar78;
        auVar73 = vmovshdup_avx512vl(auVar72);
        auVar74 = vsubss_avx512f(ZEXT416(*(uint *)((long)&(this_02->values).alloc.memoryResource + 4
                                                  )),auVar73);
        auVar170 = (undefined1  [56])0x0;
        do {
          auVar131 = ZEXT416((uint)(fVar195 *
                                   (*(float *)&(this_02->values).alloc.memoryResource -
                                   auVar72._0_4_)));
          bVar69 = false;
          bVar71 = uVar50 == 0;
          psVar58 = (size_t *)((long)&(this_02->values).ptr + 4);
          fVar233 = fVar195;
          fVar250 = auVar72._0_4_;
          if (!bVar71) {
            auVar131 = ZEXT416((uint)(fVar130 * auVar74._0_4_));
            bVar69 = uVar50 == 0;
            bVar71 = uVar50 == 1;
            psVar58 = &(this_02->values).nAlloc;
            fVar233 = fVar130;
            fVar250 = auVar73._0_4_;
            if (!bVar71) {
              auVar131 = ZEXT416((uint)(fVar196 * (*(float *)&(this_02->values).ptr - fVar78)));
              psVar58 = (size_t *)((long)&(this_02->values).nAlloc + 4);
              fVar233 = fVar196;
              fVar250 = fVar78;
            }
          }
          auVar76 = ZEXT416((uint)((*(float *)psVar58 - fVar250) * fVar233));
          auVar132 = vminss_avx(auVar76,auVar131);
          auVar131 = vmaxss_avx(auVar131,auVar76);
          vmaxss_avx512f(auVar132,in_ZMM17._0_16_);
          auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 1.0000004)),auVar232._0_16_);
          auVar232 = ZEXT1664(auVar131);
          afVar137 = (float  [4])vucomiss_avx512f(auVar131);
          in_ZMM17 = ZEXT1664((undefined1  [16])afVar137);
          if (!bVar69 && !bVar71) {
            this_04 = local_1f0;
            if (!bVar70) goto LAB_00446a00;
            break;
          }
          bVar70 = 1 < uVar50;
          uVar50 = uVar50 + 1;
        } while (uVar50 != 3);
        uVar171 = (undefined4)this_02[2].values.nStored;
        local_448._4_4_ = uVar171;
        local_448._0_4_ = uVar171;
        fStack_440 = (float)uVar171;
        fStack_43c = (float)uVar171;
        auVar129 = ZEXT856(local_448._8_8_);
        local_44c = auVar131._0_4_;
        local_438.values = afVar137;
        local_328 = auVar72;
        _local_188 = auVar73;
        SVar251 = DenselySampledSpectrum::Sample
                            ((DenselySampledSpectrum *)&(this_02->values).nStored,local_358);
        auVar162._0_8_ = SVar251.values.values._8_8_;
        auVar162._8_56_ = auVar170;
        auVar113._0_8_ = SVar251.values.values._0_8_;
        auVar113._8_56_ = auVar129;
        auVar72 = vmovlhps_avx(auVar113._0_16_,auVar162._0_16_);
        local_1e8._4_4_ = auVar72._4_4_ * (float)local_448._4_4_;
        local_1e8._0_4_ = auVar72._0_4_ * (float)local_448._0_4_;
        fStack_1e0 = auVar72._8_4_ * fStack_440;
        fStack_1dc = auVar72._12_4_ * fStack_43c;
        uVar171 = (undefined4)this_02[2].values.nStored;
        local_448._4_4_ = uVar171;
        local_448._0_4_ = uVar171;
        fStack_440 = (float)uVar171;
        fStack_43c = (float)uVar171;
        auVar129 = ZEXT856(local_448._8_8_);
        SVar251 = DenselySampledSpectrum::Sample
                            ((DenselySampledSpectrum *)&this_02[1].values.nStored,pSVar49);
        auVar163._0_8_ = SVar251.values.values._8_8_;
        auVar163._8_56_ = auVar170;
        auVar114._0_8_ = SVar251.values.values._0_8_;
        auVar114._8_56_ = auVar129;
        fVar78 = *(float *)&(this_02->values).ptr;
        auVar74 = vpcmpeqd_avx(auVar75,auVar75);
        auVar197 = ZEXT816(0) << 0x40;
        lVar60 = 0;
        fVar195 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar78;
        auVar212._0_4_ = local_348._0_4_ / fVar195;
        auVar212._4_12_ = local_348._4_12_;
        local_458[1] = auVar212._0_4_;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = (this_02->values).alloc.memoryResource;
        auVar194._8_8_ = 0;
        auVar194._0_8_ = *(ulong *)((long)&(this_02->values).ptr + 4);
        iVar55 = *(int *)&this_02[10].values.ptr;
        auVar73 = vsubps_avx(auVar194,auVar182);
        auVar72 = vsubps_avx(local_328,auVar182);
        auVar72 = vdivps_avx(auVar72,auVar73);
        auVar73 = vdivps_avx(local_318,auVar73);
        auVar75 = vbroadcastss_avx512vl((undefined1  [16])local_438.values);
        local_458[2] = auVar73._0_4_;
        local_458[0] = (float)vextractps_avx(auVar73,1);
        auVar183._0_4_ = auVar72._0_4_ + auVar75._0_4_ * auVar73._0_4_;
        auVar183._4_4_ = auVar72._4_4_ + auVar75._4_4_ * auVar73._4_4_;
        auVar183._8_4_ = auVar72._8_4_ + auVar75._8_4_ * auVar73._8_4_;
        auVar183._12_4_ = auVar72._12_4_ + auVar75._12_4_ * auVar73._12_4_;
        auVar75 = vmovshdup_avx(auVar183);
        auVar221._8_8_ = 0;
        auVar221._0_8_ = this_02[10].values.alloc.memoryResource;
        auVar72 = vcvtdq2ps_avx(auVar221);
        auVar73 = vpaddd_avx(auVar74,auVar221);
        auVar73 = vcvtdq2ps_avx(auVar73);
        fVar130 = auVar72._0_4_;
        auVar226._0_4_ = auVar183._0_4_ * fVar130;
        auVar226._4_4_ = auVar183._4_4_ * auVar72._4_4_;
        auVar226._8_4_ = auVar183._8_4_ * auVar72._8_4_;
        auVar226._12_4_ = auVar183._12_4_ * auVar72._12_4_;
        auVar131 = vmovshdup_avx(auVar73);
        uVar51 = vcmpps_avx512vl(auVar73,auVar226,1);
        auVar132 = vmovshdup_avx(auVar226);
        uVar2 = vcmpss_avx512f(auVar132,auVar197,1);
        bVar53 = (byte)(uVar51 >> 1);
        auVar74 = vmovlhps_avx(auVar114._0_16_,auVar163._0_16_);
        local_198._0_4_ = auVar74._0_4_ * (float)local_448._0_4_;
        local_198._4_4_ = auVar74._4_4_ * (float)local_448._4_4_;
        fStack_190 = auVar74._8_4_ * fStack_440;
        fStack_18c = auVar74._12_4_ * fStack_43c;
        auVar76 = vmulss_avx512f((undefined1  [16])local_438.values,auVar212);
        auVar74 = vmovshdup_avx(auVar72);
        local_168 = vaddps_avx512vl(_local_198,_local_1e8);
        auVar232 = ZEXT1664(local_168);
        fVar78 = ((float)local_338._0_4_ - fVar78) / fVar195 + auVar76._0_4_;
        auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar55);
        uVar9 = vcmpss_avx512f(auVar226,auVar197,1);
        auVar76 = vcvtsi2ss_avx512f(in_XMM18,iVar55 + -1);
        iVar55 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) *
                             ((uint)(bVar53 & 1) * auVar131._0_4_ +
                             (uint)!(bool)(bVar53 & 1) * auVar132._0_4_));
        iVar56 = (int)(float)((uint)!(bool)((byte)uVar9 & 1) *
                             ((uint)((byte)uVar51 & 1) * auVar73._0_4_ +
                             (uint)!(bool)((byte)uVar51 & 1) * (int)auVar226._0_4_));
        fVar195 = auVar72._0_4_;
        auVar72 = vminss_avx(auVar76,ZEXT416((uint)(fVar78 * fVar195)));
        uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar78 * fVar195)),auVar197,1);
        iVar57 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) * auVar72._0_4_);
        fVar196 = auVar74._0_4_;
        do {
          pfVar61 = local_458 + 2;
          iVar59 = (int)lVar60;
          if (iVar59 != 0) {
            if (iVar59 == 1) {
              pfVar61 = local_458;
            }
            else {
              pfVar61 = local_458 + 1;
            }
          }
          if ((*pfVar61 == 0.0) && (!NAN(*pfVar61))) {
            pfVar61 = local_458 + 2;
            if (iVar59 != 0) {
              if (iVar59 == 1) {
                pfVar61 = local_458;
              }
              else {
                pfVar61 = local_458 + 1;
              }
            }
            *pfVar61 = 0.0;
          }
          if (iVar59 == 1) {
            local_424[1] = iVar55;
            piVar62 = local_370 + 1;
            piVar63 = local_370 + 4;
            pfVar61 = (float *)((long)&local_408 + 4);
            pIVar67 = (Interval<float> *)
                      &local_3d8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            pfVar65 = local_458;
            iVar64 = iVar55;
          }
          else if (iVar59 == 0) {
            local_424[lVar60] = iVar56;
            piVar62 = local_370;
            piVar63 = local_370 + 3;
            pfVar61 = (float *)&local_408;
            pIVar67 = (Interval<float> *)&local_3d8;
            pfVar65 = local_458 + 2;
            iVar64 = iVar56;
          }
          else {
            piVar62 = local_370 + 2;
            piVar63 = local_370 + 5;
            pfVar61 = &local_400;
            pIVar67 = &local_3d8.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
            pfVar65 = local_458 + 1;
            local_424[lVar60] = iVar57;
            iVar64 = iVar57;
          }
          if (0.0 <= *pfVar65) {
            auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64 + 1);
            fVar233 = auVar72._0_4_;
            if (iVar59 == 1) {
              auVar249 = ZEXT464((uint)local_458[0]);
              auVar244._0_4_ = (fVar233 / fVar196 - auVar75._0_4_) / local_458[0];
              auVar244._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar244);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar196) / local_458[0];
              pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&this_02[10].values.alloc.memoryResource + 4);
            }
            else if (iVar59 == 0) {
              auVar249 = ZEXT464((uint)local_458[2]);
              auVar243._0_4_ = (fVar233 / fVar130 - auVar183._0_4_) / local_458[2];
              auVar243._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar243);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar130) / local_458[2];
              pvVar68 = &this_02[10].values;
            }
            else {
              auVar249 = ZEXT464((uint)local_458[1]);
              auVar245._0_4_ = (fVar233 / fVar195 - fVar78) / local_458[1];
              auVar245._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar245);
              (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
              fVar233 = (1.0 / fVar195) / local_458[1];
              pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        &this_02[10].values.ptr;
            }
            *pfVar61 = fVar233;
            *piVar63 = 1;
            iVar59 = *(int *)&(pvVar68->alloc).memoryResource;
          }
          else {
            auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64);
            fVar233 = auVar72._0_4_;
            if (iVar59 == 1) {
              auVar72 = ZEXT416((uint)(fVar233 / fVar196 - auVar75._0_4_));
              fVar233 = local_458[0];
              fVar250 = -(1.0 / fVar196);
            }
            else if (iVar59 == 0) {
              auVar72 = ZEXT416((uint)(fVar233 / fVar130 - auVar183._0_4_));
              fVar233 = local_458[2];
              fVar250 = -(1.0 / fVar130);
            }
            else {
              auVar72 = ZEXT416((uint)(fVar233 / fVar195 - fVar78));
              fVar233 = local_458[1];
              fVar250 = -(1.0 / fVar195);
            }
            auVar248._0_4_ = auVar72._0_4_ / fVar233;
            auVar248._4_12_ = auVar72._4_12_;
            auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar248);
            auVar249 = ZEXT1664(auVar72);
            *piVar63 = -1;
            iVar59 = -1;
            (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
            *pfVar61 = fVar250 / fVar233;
          }
          lVar60 = lVar60 + 1;
          *piVar62 = iVar59;
        } while (lVar60 != 3);
        uVar51 = local_3b8._0_8_ * 0x5851f42d4c957f2d + (long)local_3a8;
        uVar50 = local_3b8._4_4_ >> 0xd ^ (uint)((ulong)local_3b8._0_8_ >> 0x1b);
        bVar53 = local_3b8[7] >> 3;
        auVar72 = vcvtusi2ss_avx512f(in_XMM18,uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
        local_1a8 = (undefined1  [8])((ulong)this_02 | 0x4000000000000);
        auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        in_ZMM4 = ZEXT1664(auVar72);
        local_1b8._0_8_ = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
        aVar145.values = local_438.values;
        fVar78 = local_44c;
        while( true ) {
          in_ZMM17 = ZEXT1664((undefined1  [16])aVar145.values);
          lVar60 = (long)*(int *)(&DAT_0061fea0 +
                                 (ulong)((uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
                                                .high < local_3d8.
                                                        super_Point3<pbrt::Interval<float>_>.
                                                                                                                
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                        (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                               low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                        (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                               low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
          fVar130 = (&local_3d8.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60];
          uVar171 = *(undefined4 *)
                     (this_02[9].values.nAlloc +
                     (((long)local_424[2] *
                       (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                      (long)local_424[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource +
                     (long)local_424[0]) * 4);
          auVar40._4_4_ = uVar171;
          auVar40._0_4_ = uVar171;
          auVar40._8_4_ = uVar171;
          auVar40._12_4_ = uVar171;
          auVar72 = vmulps_avx512vl(auVar232._0_16_,auVar40);
          if (0.0 < auVar72._0_4_) {
            auVar73 = vsubss_avx512f(ZEXT416((uint)fVar130),(undefined1  [16])aVar145.values);
            local_418[0] = in_ZMM4._0_4_;
            local_1d8 = (undefined1  [8])(auVar72._0_8_ ^ 0x8000000080000000);
            fStack_1d0 = (float)(auVar72._8_4_ ^ 0x80000000);
            fStack_1cc = (float)(auVar72._12_4_ ^ 0x80000000);
            local_45c = fVar130;
            local_438.values = aVar145.values;
            local_3b8 = auVar72;
            fVar78 = expf(auVar73._0_4_ * -auVar72._0_4_);
            fVar78 = 1.0 - fVar78;
            if (local_418[0] < fVar78) {
              auVar232 = ZEXT1664((undefined1  [16])local_438.values);
              auVar41._8_4_ = 0x80000000;
              auVar41._0_8_ = 0x8000000080000000;
              auVar41._12_4_ = 0x80000000;
              _local_178 = vxorps_avx512vl(local_3b8,auVar41);
              uVar52 = uVar51;
              do {
                local_438.values = auVar232._0_16_;
                fVar78 = logf(1.0 - local_418[0]);
                pSVar49 = local_358;
                fVar78 = local_438.values[0] - fVar78 / (float)local_3b8._0_4_;
                in_ZMM4 = ZEXT464((uint)fVar78);
                if (local_44c <= fVar78) goto LAB_004469ae;
                local_448._0_4_ = fVar78;
                auVar72 = vinsertps_avx(ZEXT416((uint)(fVar78 * (float)local_318._0_4_ +
                                                      (float)local_328._0_4_)),
                                        ZEXT416((uint)(fVar78 * (float)local_398._0_4_ +
                                                      (float)local_188._0_4_)),0x10);
                local_3e8.z = fVar78 * (float)local_348._0_4_ + (float)local_338._0_4_;
                auVar184._8_4_ = 0x3da1d5b6;
                auVar184._0_8_ = 0x3da1d5b63da1d5b6;
                auVar184._12_4_ = 0x3da1d5b6;
                local_3e8._0_8_ = vmovlps_avx(auVar72);
                fVar78 = fVar78 - local_438.values[0];
                auVar91._0_4_ = fVar78 * (float)local_178._0_4_;
                auVar91._4_4_ = fVar78 * (float)local_178._4_4_;
                auVar91._8_4_ = fVar78 * fStack_170;
                auVar91._12_4_ = fVar78 * fStack_16c;
                auVar42._8_4_ = 0x3fb8aa3b;
                auVar42._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar42._12_4_ = 0x3fb8aa3b;
                auVar73 = vmulps_avx512vl(auVar91,auVar42);
                auVar72 = vroundps_avx(auVar73,9);
                auVar73 = vsubps_avx(auVar73,auVar72);
                auVar43._8_4_ = 0x3e658299;
                auVar43._0_8_ = 0x3e6582993e658299;
                auVar43._12_4_ = 0x3e658299;
                auVar74 = vfmadd213ps_avx512vl(auVar184,auVar73,auVar43);
                auVar149._0_4_ = (int)auVar72._0_4_;
                auVar149._4_4_ = (int)auVar72._4_4_;
                auVar149._8_4_ = (int)auVar72._8_4_;
                auVar149._12_4_ = (int)auVar72._12_4_;
                auVar129 = ZEXT856(auVar149._8_8_);
                auVar44._8_4_ = 0xffffffe1;
                auVar44._0_8_ = 0xffffffe1ffffffe1;
                auVar44._12_4_ = 0xffffffe1;
                uVar51 = vpcmpgtd_avx512vl(auVar149,auVar44);
                uVar51 = uVar51 & 0xf;
                auVar45._8_4_ = 0x1e;
                auVar45._0_8_ = 0x1e0000001e;
                auVar45._12_4_ = 0x1e;
                uVar54 = vpcmpgtd_avx512vl(auVar149,auVar45);
                uVar54 = uVar54 & 0xf;
                auVar46._8_4_ = 0x3f3263b7;
                auVar46._0_8_ = 0x3f3263b73f3263b7;
                auVar46._12_4_ = 0x3f3263b7;
                auVar72 = vfmadd213ps_avx512vl(auVar74,auVar73,auVar46);
                auVar47._8_4_ = 0x3f7ff3bf;
                auVar47._0_8_ = 0x3f7ff3bf3f7ff3bf;
                auVar47._12_4_ = 0x3f7ff3bf;
                auVar72 = vfmadd213ps_avx512vl(auVar72,auVar73,auVar47);
                auVar73 = vpslld_avx(auVar149,0x17);
                auVar72 = vpaddd_avx(auVar73,auVar72);
                auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar70 = (bool)((byte)uVar54 & 1);
                local_438.values[0] =
                     (float)((uint)bVar70 * auVar73._0_4_ |
                            (uint)!bVar70 * (uint)((byte)uVar51 & 1) * auVar72._0_4_);
                bVar70 = (bool)((byte)(uVar54 >> 1) & 1);
                local_438.values[1] =
                     (float)((uint)bVar70 * auVar73._4_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_);
                bVar70 = (bool)((byte)(uVar54 >> 2) & 1);
                local_438.values[2] =
                     (float)((uint)bVar70 * auVar73._8_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_);
                bVar70 = SUB81(uVar54 >> 3,0);
                local_438.values[3] =
                     (float)((uint)bVar70 * auVar73._12_4_ |
                            (uint)!bVar70 * (uint)(byte)(uVar51 >> 3) * auVar72._12_4_);
                auVar170 = ZEXT856(local_438.values._8_8_);
                SVar251 = NanoVDBMediumProvider::Density
                                    (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_3e8,
                                     local_358);
                auVar164._0_8_ = SVar251.values.values._8_8_;
                auVar164._8_56_ = auVar129;
                auVar115._0_8_ = SVar251.values.values._0_8_;
                auVar115._8_56_ = auVar170;
                local_418 = (float  [4])vmovlhps_avx(auVar115._0_16_,auVar164._0_16_);
                auVar170 = ZEXT856(local_418._8_8_);
                SVar251 = NanoVDBMediumProvider::Le
                                    (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_3e8,
                                     pSVar49);
                auVar132 = _local_1a8;
                auVar131 = local_1b8;
                auVar165._0_8_ = SVar251.values.values._8_8_;
                auVar165._8_56_ = auVar129;
                auVar116._0_8_ = SVar251.values.values._0_8_;
                auVar116._8_56_ = auVar170;
                fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                local_298[1].low = (ray->super_Ray).time;
                local_240 = local_418[0] * (float)local_198._0_4_;
                fStack_23c = local_418[1] * (float)local_198._4_4_;
                fStack_238 = local_418[2] * fStack_190;
                fStack_234 = local_418[3] * fStack_18c;
                in_ZMM4 = ZEXT1664(_local_240);
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                        *(float *)((long)&this_02[7].values.ptr + 4)
                                                        )),ZEXT416((uint)local_3e8.x),
                                          ZEXT416(*(uint *)&this_02[7].values.ptr));
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y * (float)this_02[7].lambda_max)
                                                 ),ZEXT416((uint)local_3e8.x),
                                          ZEXT416((uint)this_02[7].lambda_min));
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                        *(float *)((long)&this_02[6].values.alloc.
                                                                          memoryResource + 4))),
                                          ZEXT416((uint)local_3e8.x),
                                          ZEXT416(*(uint *)&this_02[6].values.alloc.memoryResource))
                ;
                auVar75 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                        *(float *)((long)&this_02[6].values.nAlloc +
                                                                  4))),ZEXT416((uint)local_3e8.x),
                                          ZEXT416((uint)this_02[6].values.nAlloc));
                auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)local_3e8.z),
                                          ZEXT416((uint)this_02[7].values.nAlloc));
                auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)local_3e8.z),
                                          ZEXT416(*(uint *)&this_02[7].values.alloc.memoryResource))
                ;
                auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)local_3e8.z),
                                          ZEXT416((uint)this_02[6].values.nStored));
                auVar74 = vfmadd231ss_fma(auVar74,ZEXT416((uint)local_3e8.z),
                                          ZEXT416(*(uint *)&this_02[6].values.ptr));
                fVar130 = auVar72._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
                fVar195 = auVar73._0_4_ +
                          *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
                fVar196 = auVar75._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
                fVar233 = auVar74._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
                bVar70 = fVar130 == 1.0;
                iVar55 = (uint)bVar70 * (int)fVar195 + (uint)!bVar70 * (int)(fVar195 / fVar130);
                iVar56 = (uint)bVar70 * (int)fVar233 + (uint)!bVar70 * (int)(fVar233 / fVar130);
                auVar222._4_4_ = iVar56;
                auVar222._0_4_ = iVar56;
                auVar222._8_4_ = iVar56;
                auVar222._12_4_ = iVar56;
                iVar56 = (uint)bVar70 * (int)fVar196 + (uint)!bVar70 * (int)(fVar196 / fVar130);
                uVar5._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                uVar5._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar213._8_8_ = 0;
                auVar213._0_8_ = uVar5;
                local_298[5].low = 0.0;
                auVar207._4_4_ = iVar56;
                auVar207._0_4_ = iVar56;
                auVar207._8_4_ = iVar56;
                auVar207._12_4_ = iVar56;
                _local_2a8 = vmovlhps_avx(auVar222,auVar207);
                auVar223._4_4_ = iVar55;
                auVar223._0_4_ = iVar55;
                auVar223._8_4_ = iVar55;
                auVar223._12_4_ = iVar55;
                auVar230._0_4_ = (float)(undefined4)uVar5 * (float)(undefined4)uVar5;
                auVar230._4_4_ = (float)uVar5._4_4_ * (float)uVar5._4_4_;
                auVar230._8_8_ = 0;
                auVar72 = vmovshdup_avx(auVar230);
                auVar72 = vfmadd231ss_fma(auVar72,auVar213,auVar213);
                auVar214._0_8_ = uVar5 ^ 0x8000000080000000;
                auVar214._8_4_ = 0x80000000;
                auVar214._12_4_ = 0x80000000;
                auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                local_220 = vmovlhps_avx(auVar116._0_16_,auVar165._0_16_);
                local_298[2].high = auVar72._0_4_;
                auVar231._4_4_ = local_298[2].high;
                auVar231._0_4_ = local_298[2].high;
                auVar231._8_4_ = local_298[2].high;
                auVar231._12_4_ = local_298[2].high;
                local_298[2].high = -fVar78 / local_298[2].high;
                auVar72 = vdivps_avx(auVar214,auVar231);
                local_298._24_16_ = ZEXT416(0) << 0x20;
                local_230 = local_3b8;
                local_210 = true;
                local_298[0] = (Interval<float>)vmovlps_avx(auVar223);
                local_298._12_8_ = vmovlps_avx(auVar72);
                local_298[6].low = 0.0;
                local_298[6].high = 0.0;
                local_298[7].low = (float)local_1a8._0_4_;
                local_298[7].high = (float)local_1a8._4_4_;
                local_298[8].low = (float)local_1b8._0_4_;
                local_298[8].high = (float)local_1b8._4_4_;
                fStack_24c = local_418[1] * (float)local_1e8._4_4_;
                local_250 = local_418[0] * (float)local_1e8._0_4_;
                fStack_248 = local_418[2] * fStack_1e0;
                fStack_244 = local_418[3] * fStack_1dc;
                local_208.values.values = (array<float,_4>)(array<float,_4>)local_438.values;
                local_1b8 = auVar131;
                _local_1a8 = auVar132;
                bVar70 = Li::anon_class_72_9_b858679e::operator()
                                   ((anon_class_72_9_b858679e *)local_2f0,(MediumSample *)local_2a8)
                ;
                this_04 = local_1f0;
                if (!bVar70) goto LAB_00446a00;
                uVar51 = uVar52 * 0x5851f42d4c957f2d + (long)local_3a8;
                uVar50 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
                bVar53 = (byte)(uVar52 >> 0x3b);
                auVar72 = vcvtusi2ss_avx512f(auVar249._0_16_,
                                             uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
                auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),
                                     ZEXT416(0x3f7fffff));
                local_418[0] = auVar72._0_4_;
                fVar78 = expf((local_45c - (float)local_448._0_4_) * (float)local_1d8._0_4_);
                auVar232 = ZEXT464((uint)local_448._0_4_);
                fVar78 = 1.0 - fVar78;
                uVar52 = uVar51;
              } while (local_418[0] < fVar78);
            }
            auVar232 = ZEXT1664(local_168);
            auVar72 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                 ZEXT416((uint)((local_418[0] - fVar78) / (1.0 - fVar78))));
            in_ZMM4 = ZEXT1664(auVar72);
            fVar130 = local_45c;
            fVar78 = local_44c;
          }
          this_04 = local_1f0;
          if ((fVar78 < fVar130) ||
             (iVar55 = local_424[lVar60], iVar56 = local_370[lVar60 + 3],
             local_424[lVar60] = iVar55 + iVar56, this_04 = local_1f0,
             iVar55 + iVar56 == local_370[lVar60])) break;
          aVar145.values = (float  [4])ZEXT416((uint)fVar130);
          (&local_3d8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60] =
               fVar130 + *(float *)((long)&local_408 + lVar60 * 4);
        }
      }
      goto LAB_00446a00;
    }
    if ((uVar51 & 0x3000000000000) == 0x2000000000000) {
      local_338._0_8_ = uVar51;
      local_2f0._8_8_ = &local_308;
      local_2f0._0_8_ = local_378;
      local_2f0._24_8_ = &local_45e;
      local_2f0._16_8_ = local_358;
      local_2d0 = &local_3bc;
      local_2b0 = &local_45d;
      local_2c0 = &local_1c8;
      local_2c8 = local_380;
      uVar51._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar51._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar51;
      fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_400 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      local_408._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      local_408._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar76._0_4_ = (float)(undefined4)uVar51 * (float)(undefined4)uVar51;
      auVar76._4_4_ = (float)uVar51._4_4_ * (float)uVar51._4_4_;
      auVar76._8_8_ = 0;
      auVar73 = vmovshdup_avx(auVar76);
      auVar73 = vfmadd231ss_fma(auVar73,auVar74,auVar74);
      auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
      auVar73 = vsqrtss_avx(auVar73,auVar73);
      fVar130 = auVar73._0_4_;
      local_45c = fVar130 * (float)local_448._0_4_;
      auVar197._4_4_ = fVar130;
      auVar197._0_4_ = fVar130;
      auVar197._8_4_ = fVar130;
      auVar197._12_4_ = fVar130;
      local_448._0_4_ = fVar78 / fVar130;
      register0x00001204 = SUB6012((undefined1  [60])0x0,0);
      auVar73 = vdivps_avx(auVar74,auVar197);
      uVar2 = vmovlps_avx(auVar73);
      auVar73._4_4_ = (undefined4)local_408;
      auVar73._0_4_ = (undefined4)local_408;
      auVar73._8_4_ = (undefined4)local_408;
      auVar73._12_4_ = (undefined4)local_408;
      auVar75._4_4_ = local_408._4_4_;
      auVar75._0_4_ = local_408._4_4_;
      auVar75._8_4_ = local_408._4_4_;
      auVar75._12_4_ = local_408._4_4_;
      local_3fc._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_3d8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar73,auVar75);
      auVar131._4_4_ = local_400;
      auVar131._0_4_ = local_400;
      auVar131._8_4_ = local_400;
      auVar131._12_4_ = local_400;
      local_418[1] = local_3fc._4_4_;
      local_418[0] = local_3fc._4_4_;
      local_418[2] = local_3fc._4_4_;
      local_418[3] = local_3fc._4_4_;
      local_3d8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)vmovlps_avx(auVar131);
      local_3fc._0_4_ = (float)uVar2;
      local_438.values[1] = (float)local_3fc;
      local_438.values[0] = (float)local_3fc;
      local_438.values[2] = (float)local_3fc;
      local_438.values[3] = (float)local_3fc;
      local_3fc = uVar2;
      local_3f4 = (float)local_448._0_4_;
      Transform::operator()((Point3fi *)local_2a8,this_00,&local_3d8);
      auVar73 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_max),
                              ZEXT416(*(uint *)((long)&this_02[3].values.ptr + 4)),0x10);
      auVar74 = vinsertps_avx(ZEXT416((uint)this_02[3].lambda_min),
                              ZEXT416(*(uint *)&this_02[3].values.ptr),0x10);
      auVar75 = vinsertps_avx(ZEXT416(*(uint *)&this_02[3].values.alloc.memoryResource),
                              ZEXT416((uint)this_02[3].values.nAlloc),0x10);
      auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_418[0] *
                                               *(float *)((long)&this_02[3].values.nStored + 4))),
                                 (undefined1  [16])local_438.values,
                                 ZEXT416((uint)this_02[3].values.nStored));
      local_398 = vfmadd231ss_fma(auVar131,_local_448,ZEXT416((uint)this_02[4].lambda_min));
      auVar132._0_4_ = local_418[0] * auVar73._0_4_;
      auVar132._4_4_ = local_418[1] * auVar73._4_4_;
      auVar132._8_4_ = local_418[2] * auVar73._8_4_;
      auVar132._12_4_ = local_418[3] * auVar73._12_4_;
      uVar171 = local_448._0_4_;
      auVar234._4_4_ = uVar171;
      auVar234._0_4_ = uVar171;
      auVar234._8_4_ = uVar171;
      auVar234._12_4_ = uVar171;
      auVar73 = vfmadd213ps_fma(auVar74,(undefined1  [16])local_438.values,auVar132);
      local_348 = vfmadd213ps_fma(auVar234,auVar75,auVar73);
      local_328 = vmovshdup_avx(local_348);
      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_328._0_4_ * local_328._0_4_)),local_348,
                                local_348);
      auVar73 = vfmadd231ss_fma(auVar73,local_398,local_398);
      if (auVar73._0_4_ <= 0.0) {
        auVar86._8_8_ = 0;
        auVar86._0_4_ = local_298[0].low;
        auVar86._4_4_ = local_298[0].high;
        fVar78 = local_45c;
      }
      else {
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar74 = vandps_avx(local_328,auVar186);
        auVar75 = vandps_avx(local_348,auVar186);
        auVar131 = vandps_avx(local_398,auVar186);
        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar75);
        auVar74 = vfmadd231ss_fma(auVar74,ZEXT816(0) << 0x20,auVar131);
        fVar130 = auVar74._0_4_ / auVar73._0_4_;
        fVar78 = local_348._0_4_ * fVar130;
        local_448._0_4_ = fVar130;
        IVar79.high = fVar78;
        IVar79.low = fVar78;
        local_438.values = (float  [4])ZEXT416((uint)(local_398._0_4_ * fVar130));
        auVar232._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_2a8,IVar79);
        auVar232._8_56_ = extraout_var_02;
        uVar2 = vmovlps_avx(auVar232._0_16_);
        local_2a8 = (undefined1  [8])uVar2;
        i.high = (float)local_448._0_4_ * (float)local_328._0_4_;
        i.low = (float)local_448._0_4_ * (float)local_328._0_4_;
        auVar249._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_2a8 + 8),i);
        auVar249._8_56_ = extraout_var_03;
        uVar2 = vmovlps_avx(auVar249._0_16_);
        IStack_2a0 = (Interval<float>)uVar2;
        i_00.high = local_438.values[0];
        i_00.low = local_438.values[0];
        auVar96._0_8_ = Interval<float>::operator+<float>(local_298,i_00);
        auVar96._8_56_ = extraout_var_04;
        auVar86 = auVar96._0_16_;
        fVar78 = local_45c - (float)local_448._0_4_;
      }
      pSVar49 = local_358;
      auVar232 = ZEXT464((uint)fVar78);
      auVar75 = SUB6416(ZEXT464(0x3f800003),0);
      auVar73 = vhaddps_avx(auVar86,auVar86);
      local_44c = auVar73._0_4_ * 0.5;
      auVar72 = vxorps_avx512vl(auVar72,auVar72);
      in_ZMM17 = ZEXT1664(auVar72);
      bVar70 = false;
      uVar50 = 0;
      auVar72 = vinsertps_avx(_local_2a8,ZEXT416((uint)IStack_2a0.high),0x10);
      fVar78 = 1.0 / local_328._0_4_;
      auVar143._0_4_ = local_2a8._4_4_ + auVar72._0_4_;
      auVar143._4_4_ = local_2a8._8_4_ + auVar72._4_4_;
      auVar143._8_4_ = auVar72._8_4_ + 0.0;
      auVar143._12_4_ = auVar72._12_4_ + 0.0;
      auVar72._8_4_ = 0x3f000000;
      auVar72._0_8_ = 0x3f0000003f000000;
      auVar72._12_4_ = 0x3f000000;
      auVar72 = vmulps_avx512vl(auVar143,auVar72);
      fVar130 = 1.0 / local_348._0_4_;
      fVar195 = 1.0 / local_398._0_4_;
      in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar195));
      auVar73 = vmovshdup_avx512vl(auVar72);
      auVar74 = vsubss_avx512f(ZEXT416(*(uint *)((long)&(this_02->values).alloc.memoryResource + 4))
                               ,auVar73);
      auVar170 = (undefined1  [56])0x0;
      do {
        auVar131 = ZEXT416((uint)(fVar130 *
                                 (*(float *)&(this_02->values).alloc.memoryResource - auVar72._0_4_)
                                 ));
        bVar69 = false;
        bVar71 = uVar50 == 0;
        psVar58 = (size_t *)((long)&(this_02->values).ptr + 4);
        fVar196 = fVar130;
        fVar233 = auVar72._0_4_;
        if (!bVar71) {
          auVar131 = ZEXT416((uint)(fVar78 * auVar74._0_4_));
          bVar69 = uVar50 == 0;
          bVar71 = uVar50 == 1;
          psVar58 = &(this_02->values).nAlloc;
          fVar196 = fVar78;
          fVar233 = auVar73._0_4_;
          if (!bVar71) {
            auVar131 = ZEXT416((uint)(fVar195 * (*(float *)&(this_02->values).ptr - local_44c)));
            psVar58 = (size_t *)((long)&(this_02->values).nAlloc + 4);
            fVar196 = fVar195;
            fVar233 = local_44c;
          }
        }
        auVar76 = ZEXT416((uint)((*(float *)psVar58 - fVar233) * fVar196));
        auVar132 = vminss_avx(auVar76,auVar131);
        auVar131 = vmaxss_avx(auVar131,auVar76);
        vmaxss_avx512f(auVar132,in_ZMM17._0_16_);
        auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 1.0000004)),auVar232._0_16_);
        auVar232 = ZEXT1664(auVar131);
        afVar137 = (float  [4])vucomiss_avx512f(auVar131);
        in_ZMM17 = ZEXT1664((undefined1  [16])afVar137);
        if (!bVar69 && !bVar71) {
          this_04 = local_1f0;
          if (!bVar70) goto LAB_00446a00;
          break;
        }
        bVar70 = 1 < uVar50;
        uVar50 = uVar50 + 1;
      } while (uVar50 != 3);
      uVar171 = (undefined4)this_02[2].values.nStored;
      local_448._4_4_ = uVar171;
      local_448._0_4_ = uVar171;
      fStack_440 = (float)uVar171;
      fStack_43c = (float)uVar171;
      auVar129 = ZEXT856(local_448._8_8_);
      local_45c = auVar131._0_4_;
      local_438.values = afVar137;
      _local_1e8 = auVar72;
      _local_198 = auVar73;
      SVar251 = DenselySampledSpectrum::Sample
                          ((DenselySampledSpectrum *)&(this_02->values).nStored,local_358);
      auVar155._0_8_ = SVar251.values.values._8_8_;
      auVar155._8_56_ = auVar170;
      auVar106._0_8_ = SVar251.values.values._0_8_;
      auVar106._8_56_ = auVar129;
      auVar72 = vmovlhps_avx(auVar106._0_16_,auVar155._0_16_);
      local_1d8._4_4_ = auVar72._4_4_ * (float)local_448._4_4_;
      local_1d8._0_4_ = auVar72._0_4_ * (float)local_448._0_4_;
      fStack_1d0 = auVar72._8_4_ * fStack_440;
      fStack_1cc = auVar72._12_4_ * fStack_43c;
      uVar171 = (undefined4)this_02[2].values.nStored;
      local_448._4_4_ = uVar171;
      local_448._0_4_ = uVar171;
      fStack_440 = (float)uVar171;
      fStack_43c = (float)uVar171;
      auVar129 = ZEXT856(local_448._8_8_);
      SVar251 = DenselySampledSpectrum::Sample
                          ((DenselySampledSpectrum *)&this_02[1].values.nStored,pSVar49);
      auVar156._0_8_ = SVar251.values.values._8_8_;
      auVar156._8_56_ = auVar170;
      auVar107._0_8_ = SVar251.values.values._0_8_;
      auVar107._8_56_ = auVar129;
      fVar78 = *(float *)&(this_02->values).ptr;
      auVar74 = vpcmpeqd_avx(auVar75,auVar75);
      auVar197 = ZEXT816(0) << 0x40;
      lVar60 = 0;
      fVar195 = *(float *)((long)&(this_02->values).nAlloc + 4) - fVar78;
      auVar208._0_4_ = local_398._0_4_ / fVar195;
      auVar208._4_12_ = local_398._4_12_;
      local_458[1] = auVar208._0_4_;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = (this_02->values).alloc.memoryResource;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = *(ulong *)((long)&(this_02->values).ptr + 4);
      iVar55 = *(int *)&this_02[10].values.ptr;
      auVar73 = vsubps_avx(auVar191,auVar176);
      auVar72 = vsubps_avx(_local_1e8,auVar176);
      auVar72 = vdivps_avx(auVar72,auVar73);
      auVar73 = vdivps_avx(local_348,auVar73);
      auVar75 = vbroadcastss_avx512vl((undefined1  [16])local_438.values);
      local_458[2] = auVar73._0_4_;
      local_458[0] = (float)vextractps_avx(auVar73,1);
      auVar177._0_4_ = auVar72._0_4_ + auVar75._0_4_ * auVar73._0_4_;
      auVar177._4_4_ = auVar72._4_4_ + auVar75._4_4_ * auVar73._4_4_;
      auVar177._8_4_ = auVar72._8_4_ + auVar75._8_4_ * auVar73._8_4_;
      auVar177._12_4_ = auVar72._12_4_ + auVar75._12_4_ * auVar73._12_4_;
      auVar75 = vmovshdup_avx(auVar177);
      auVar215._8_8_ = 0;
      auVar215._0_8_ = this_02[10].values.alloc.memoryResource;
      auVar72 = vcvtdq2ps_avx(auVar215);
      auVar73 = vpaddd_avx(auVar74,auVar215);
      auVar73 = vcvtdq2ps_avx(auVar73);
      fVar130 = auVar72._0_4_;
      auVar224._0_4_ = auVar177._0_4_ * fVar130;
      auVar224._4_4_ = auVar177._4_4_ * auVar72._4_4_;
      auVar224._8_4_ = auVar177._8_4_ * auVar72._8_4_;
      auVar224._12_4_ = auVar177._12_4_ * auVar72._12_4_;
      auVar131 = vmovshdup_avx(auVar73);
      uVar51 = vcmpps_avx512vl(auVar73,auVar224,1);
      auVar132 = vmovshdup_avx(auVar224);
      uVar2 = vcmpss_avx512f(auVar132,auVar197,1);
      bVar53 = (byte)(uVar51 >> 1);
      auVar74 = vmovlhps_avx(auVar107._0_16_,auVar156._0_16_);
      local_1a8._0_4_ = auVar74._0_4_ * (float)local_448._0_4_;
      local_1a8._4_4_ = auVar74._4_4_ * (float)local_448._4_4_;
      fStack_1a0 = auVar74._8_4_ * fStack_440;
      fStack_19c = auVar74._12_4_ * fStack_43c;
      auVar76 = vmulss_avx512f((undefined1  [16])local_438.values,auVar208);
      auVar74 = vmovshdup_avx(auVar72);
      local_168 = vaddps_avx512vl(_local_1a8,_local_1d8);
      auVar232 = ZEXT1664(local_168);
      fVar78 = (local_44c - fVar78) / fVar195 + auVar76._0_4_;
      auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar55);
      uVar9 = vcmpss_avx512f(auVar224,auVar197,1);
      auVar76 = vcvtsi2ss_avx512f(in_XMM18,iVar55 + -1);
      iVar55 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) *
                           ((uint)(bVar53 & 1) * auVar131._0_4_ +
                           (uint)!(bool)(bVar53 & 1) * auVar132._0_4_));
      iVar56 = (int)(float)((uint)!(bool)((byte)uVar9 & 1) *
                           ((uint)((byte)uVar51 & 1) * auVar73._0_4_ +
                           (uint)!(bool)((byte)uVar51 & 1) * (int)auVar224._0_4_));
      fVar195 = auVar72._0_4_;
      auVar72 = vminss_avx(auVar76,ZEXT416((uint)(fVar78 * fVar195)));
      uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar78 * fVar195)),auVar197,1);
      iVar57 = (int)(float)((uint)!(bool)((byte)uVar2 & 1) * auVar72._0_4_);
      fVar196 = auVar74._0_4_;
      do {
        pfVar61 = local_458 + 2;
        iVar59 = (int)lVar60;
        if (iVar59 != 0) {
          if (iVar59 == 1) {
            pfVar61 = local_458;
          }
          else {
            pfVar61 = local_458 + 1;
          }
        }
        if ((*pfVar61 == 0.0) && (!NAN(*pfVar61))) {
          pfVar61 = local_458 + 2;
          if (iVar59 != 0) {
            if (iVar59 == 1) {
              pfVar61 = local_458;
            }
            else {
              pfVar61 = local_458 + 1;
            }
          }
          *pfVar61 = 0.0;
        }
        if (iVar59 == 1) {
          local_424[1] = iVar55;
          piVar62 = local_370 + 1;
          piVar63 = local_370 + 4;
          pfVar61 = (float *)((long)&local_408 + 4);
          pIVar67 = (Interval<float> *)
                    &local_3d8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          pfVar65 = local_458;
          iVar64 = iVar55;
        }
        else if (iVar59 == 0) {
          local_424[lVar60] = iVar56;
          piVar62 = local_370;
          piVar63 = local_370 + 3;
          pfVar61 = (float *)&local_408;
          pIVar67 = (Interval<float> *)&local_3d8;
          pfVar65 = local_458 + 2;
          iVar64 = iVar56;
        }
        else {
          piVar62 = local_370 + 2;
          piVar63 = local_370 + 5;
          pfVar61 = &local_400;
          pIVar67 = &local_3d8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          pfVar65 = local_458 + 1;
          local_424[lVar60] = iVar57;
          iVar64 = iVar57;
        }
        if (0.0 <= *pfVar65) {
          auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64 + 1);
          fVar233 = auVar72._0_4_;
          if (iVar59 == 1) {
            auVar249 = ZEXT464((uint)local_458[0]);
            auVar238._0_4_ = (fVar233 / fVar196 - auVar75._0_4_) / local_458[0];
            auVar238._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar238);
            (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
            fVar233 = (1.0 / fVar196) / local_458[0];
            pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&this_02[10].values.alloc.memoryResource + 4);
          }
          else if (iVar59 == 0) {
            auVar249 = ZEXT464((uint)local_458[2]);
            auVar237._0_4_ = (fVar233 / fVar130 - auVar177._0_4_) / local_458[2];
            auVar237._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar237);
            (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
            fVar233 = (1.0 / fVar130) / local_458[2];
            pvVar68 = &this_02[10].values;
          }
          else {
            auVar249 = ZEXT464((uint)local_458[1]);
            auVar239._0_4_ = (fVar233 / fVar195 - fVar78) / local_458[1];
            auVar239._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar239);
            (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
            fVar233 = (1.0 / fVar195) / local_458[1];
            pvVar68 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &this_02[10].values.ptr;
          }
          *pfVar61 = fVar233;
          *piVar63 = 1;
          iVar59 = *(int *)&(pvVar68->alloc).memoryResource;
        }
        else {
          auVar72 = vcvtsi2ss_avx512f(in_XMM18,iVar64);
          fVar233 = auVar72._0_4_;
          if (iVar59 == 1) {
            auVar72 = ZEXT416((uint)(fVar233 / fVar196 - auVar75._0_4_));
            fVar233 = local_458[0];
            fVar250 = -(1.0 / fVar196);
          }
          else if (iVar59 == 0) {
            auVar72 = ZEXT416((uint)(fVar233 / fVar130 - auVar177._0_4_));
            fVar233 = local_458[2];
            fVar250 = -(1.0 / fVar130);
          }
          else {
            auVar72 = ZEXT416((uint)(fVar233 / fVar195 - fVar78));
            fVar233 = local_458[1];
            fVar250 = -(1.0 / fVar195);
          }
          auVar246._0_4_ = auVar72._0_4_ / fVar233;
          auVar246._4_12_ = auVar72._4_12_;
          auVar72 = vaddss_avx512f((undefined1  [16])local_438.values,auVar246);
          auVar249 = ZEXT1664(auVar72);
          *piVar63 = -1;
          iVar59 = -1;
          (((Point3<pbrt::Interval<float>_> *)&pIVar67->low)->
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar72._0_4_;
          *pfVar61 = fVar250 / fVar233;
        }
        lVar60 = lVar60 + 1;
        *piVar62 = iVar59;
      } while (lVar60 != 3);
      uVar51 = local_3b8._0_8_ * 0x5851f42d4c957f2d + (long)local_3a8;
      uVar50 = local_3b8._4_4_ >> 0xd ^ (uint)((ulong)local_3b8._0_8_ >> 0x1b);
      bVar53 = local_3b8[7] >> 3;
      auVar72 = vcvtusi2ss_avx512f(in_XMM18,uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
      auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      in_ZMM4 = ZEXT1664(auVar72);
      local_1b8._0_8_ = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
      aVar145.values = local_438.values;
      fVar78 = local_45c;
      while( true ) {
        in_ZMM17 = ZEXT1664((undefined1  [16])aVar145.values);
        lVar60 = (long)*(int *)(&DAT_0061fea0 +
                               (ulong)((uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                              high < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                          
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                      (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                      (uint)(local_3d8.super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             low < local_3d8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
        fVar130 = (&local_3d8.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60];
        uVar171 = *(undefined4 *)
                   (this_02[9].values.nAlloc +
                   (((long)local_424[2] *
                     (long)*(int *)((long)&this_02[10].values.alloc.memoryResource + 4) +
                    (long)local_424[1]) * (long)*(int *)&this_02[10].values.alloc.memoryResource +
                   (long)local_424[0]) * 4);
        auVar10._4_4_ = uVar171;
        auVar10._0_4_ = uVar171;
        auVar10._8_4_ = uVar171;
        auVar10._12_4_ = uVar171;
        auVar72 = vmulps_avx512vl(auVar232._0_16_,auVar10);
        if (0.0 < auVar72._0_4_) {
          local_318._0_4_ = fVar130;
          auVar73 = vsubss_avx512f(ZEXT416((uint)fVar130),(undefined1  [16])aVar145.values);
          local_418[0] = in_ZMM4._0_4_;
          local_178 = auVar72._0_8_ ^ 0x8000000080000000;
          fStack_170 = (float)(auVar72._8_4_ ^ 0x80000000);
          fStack_16c = (float)(auVar72._12_4_ ^ 0x80000000);
          local_438.values = aVar145.values;
          local_3b8 = auVar72;
          fVar78 = expf(auVar73._0_4_ * -auVar72._0_4_);
          fVar78 = 1.0 - fVar78;
          if (local_418[0] < fVar78) {
            auVar232 = ZEXT1664((undefined1  [16])local_438.values);
            auVar11._8_4_ = 0x80000000;
            auVar11._0_8_ = 0x8000000080000000;
            auVar11._12_4_ = 0x80000000;
            _local_188 = vxorps_avx512vl(local_3b8,auVar11);
            uVar52 = uVar51;
            do {
              local_438.values = auVar232._0_16_;
              fVar78 = logf(1.0 - local_418[0]);
              pSVar49 = local_358;
              fVar78 = local_438.values[0] - fVar78 / (float)local_3b8._0_4_;
              in_ZMM4 = ZEXT464((uint)fVar78);
              if (local_45c <= fVar78) goto LAB_004469ae;
              local_448._0_4_ = fVar78;
              auVar72 = vinsertps_avx(ZEXT416((uint)(fVar78 * (float)local_348._0_4_ +
                                                    (float)local_1e8._0_4_)),
                                      ZEXT416((uint)(fVar78 * (float)local_328._0_4_ +
                                                    (float)local_198._0_4_)),0x10);
              local_3e8.z = fVar78 * (float)local_398._0_4_ + local_44c;
              auVar178._8_4_ = 0x3da1d5b6;
              auVar178._0_8_ = 0x3da1d5b63da1d5b6;
              auVar178._12_4_ = 0x3da1d5b6;
              local_3e8._0_8_ = vmovlps_avx(auVar72);
              fVar78 = fVar78 - local_438.values[0];
              auVar87._0_4_ = fVar78 * (float)local_188._0_4_;
              auVar87._4_4_ = fVar78 * (float)local_188._4_4_;
              auVar87._8_4_ = fVar78 * fStack_180;
              auVar87._12_4_ = fVar78 * fStack_17c;
              auVar12._8_4_ = 0x3fb8aa3b;
              auVar12._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar12._12_4_ = 0x3fb8aa3b;
              auVar73 = vmulps_avx512vl(auVar87,auVar12);
              auVar72 = vroundps_avx(auVar73,9);
              auVar73 = vsubps_avx(auVar73,auVar72);
              auVar13._8_4_ = 0x3e658299;
              auVar13._0_8_ = 0x3e6582993e658299;
              auVar13._12_4_ = 0x3e658299;
              auVar74 = vfmadd213ps_avx512vl(auVar178,auVar73,auVar13);
              auVar144._0_4_ = (int)auVar72._0_4_;
              auVar144._4_4_ = (int)auVar72._4_4_;
              auVar144._8_4_ = (int)auVar72._8_4_;
              auVar144._12_4_ = (int)auVar72._12_4_;
              auVar129 = ZEXT856(auVar144._8_8_);
              auVar14._8_4_ = 0xffffffe1;
              auVar14._0_8_ = 0xffffffe1ffffffe1;
              auVar14._12_4_ = 0xffffffe1;
              uVar51 = vpcmpgtd_avx512vl(auVar144,auVar14);
              uVar51 = uVar51 & 0xf;
              auVar15._8_4_ = 0x1e;
              auVar15._0_8_ = 0x1e0000001e;
              auVar15._12_4_ = 0x1e;
              uVar54 = vpcmpgtd_avx512vl(auVar144,auVar15);
              uVar54 = uVar54 & 0xf;
              auVar16._8_4_ = 0x3f3263b7;
              auVar16._0_8_ = 0x3f3263b73f3263b7;
              auVar16._12_4_ = 0x3f3263b7;
              auVar72 = vfmadd213ps_avx512vl(auVar74,auVar73,auVar16);
              auVar17._8_4_ = 0x3f7ff3bf;
              auVar17._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar17._12_4_ = 0x3f7ff3bf;
              auVar72 = vfmadd213ps_avx512vl(auVar72,auVar73,auVar17);
              auVar73 = vpslld_avx(auVar144,0x17);
              auVar72 = vpaddd_avx(auVar73,auVar72);
              auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar70 = (bool)((byte)uVar54 & 1);
              local_438.values[0] =
                   (float)((uint)bVar70 * auVar73._0_4_ |
                          (uint)!bVar70 * (uint)((byte)uVar51 & 1) * auVar72._0_4_);
              bVar70 = (bool)((byte)(uVar54 >> 1) & 1);
              local_438.values[1] =
                   (float)((uint)bVar70 * auVar73._4_4_ |
                          (uint)!bVar70 * (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_);
              bVar70 = (bool)((byte)(uVar54 >> 2) & 1);
              local_438.values[2] =
                   (float)((uint)bVar70 * auVar73._8_4_ |
                          (uint)!bVar70 * (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_);
              bVar70 = SUB81(uVar54 >> 3,0);
              local_438.values[3] =
                   (float)((uint)bVar70 * auVar73._12_4_ |
                          (uint)!bVar70 * (uint)(byte)(uVar51 >> 3) * auVar72._12_4_);
              auVar170 = ZEXT856(local_438.values._8_8_);
              SVar251 = UniformGridMediumProvider::Density
                                  (*(UniformGridMediumProvider **)this_02,(Point3f *)&local_3e8,
                                   local_358);
              auVar157._0_8_ = SVar251.values.values._8_8_;
              auVar157._8_56_ = auVar129;
              auVar108._0_8_ = SVar251.values.values._0_8_;
              auVar108._8_56_ = auVar170;
              local_418 = (float  [4])vmovlhps_avx(auVar108._0_16_,auVar157._0_16_);
              auVar170 = ZEXT856(local_418._8_8_);
              SVar251 = UniformGridMediumProvider::Le
                                  (*(UniformGridMediumProvider **)this_02,(Point3f *)&local_3e8,
                                   pSVar49);
              auVar132 = local_1b8;
              auVar131 = local_338;
              auVar158._0_8_ = SVar251.values.values._8_8_;
              auVar158._8_56_ = auVar129;
              auVar109._0_8_ = SVar251.values.values._0_8_;
              auVar109._8_56_ = auVar170;
              fVar78 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              local_298[1].low = (ray->super_Ray).time;
              local_240 = local_418[0] * (float)local_1a8._0_4_;
              fStack_23c = local_418[1] * (float)local_1a8._4_4_;
              fStack_238 = local_418[2] * fStack_1a0;
              fStack_234 = local_418[3] * fStack_19c;
              in_ZMM4 = ZEXT1664(_local_240);
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                      *(float *)((long)&this_02[7].values.ptr + 4)))
                                        ,ZEXT416((uint)local_3e8.x),
                                        ZEXT416(*(uint *)&this_02[7].values.ptr));
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y * (float)this_02[7].lambda_max)),
                                        ZEXT416((uint)local_3e8.x),
                                        ZEXT416((uint)this_02[7].lambda_min));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                      *(float *)((long)&this_02[6].values.alloc.
                                                                        memoryResource + 4))),
                                        ZEXT416((uint)local_3e8.x),
                                        ZEXT416(*(uint *)&this_02[6].values.alloc.memoryResource));
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(local_3e8.y *
                                                      *(float *)((long)&this_02[6].values.nAlloc + 4
                                                                ))),ZEXT416((uint)local_3e8.x),
                                        ZEXT416((uint)this_02[6].values.nAlloc));
              auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)local_3e8.z),
                                        ZEXT416((uint)this_02[7].values.nAlloc));
              auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)local_3e8.z),
                                        ZEXT416(*(uint *)&this_02[7].values.alloc.memoryResource));
              auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)local_3e8.z),
                                        ZEXT416((uint)this_02[6].values.nStored));
              auVar74 = vfmadd231ss_fma(auVar74,ZEXT416((uint)local_3e8.z),
                                        ZEXT416(*(uint *)&this_02[6].values.ptr));
              fVar130 = auVar72._0_4_ + *(float *)((long)&this_02[7].values.nAlloc + 4);
              fVar195 = auVar73._0_4_ +
                        *(float *)((long)&this_02[7].values.alloc.memoryResource + 4);
              fVar196 = auVar75._0_4_ + *(float *)((long)&this_02[6].values.nStored + 4);
              fVar233 = auVar74._0_4_ + *(float *)((long)&this_02[6].values.ptr + 4);
              bVar70 = fVar130 == 1.0;
              iVar55 = (uint)bVar70 * (int)fVar195 + (uint)!bVar70 * (int)(fVar195 / fVar130);
              iVar56 = (uint)bVar70 * (int)fVar233 + (uint)!bVar70 * (int)(fVar233 / fVar130);
              auVar216._4_4_ = iVar56;
              auVar216._0_4_ = iVar56;
              auVar216._8_4_ = iVar56;
              auVar216._12_4_ = iVar56;
              iVar56 = (uint)bVar70 * (int)fVar196 + (uint)!bVar70 * (int)(fVar196 / fVar130);
              uVar54._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
              uVar54._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
              auVar209._8_8_ = 0;
              auVar209._0_8_ = uVar54;
              local_298[5].low = 0.0;
              auVar204._4_4_ = iVar56;
              auVar204._0_4_ = iVar56;
              auVar204._8_4_ = iVar56;
              auVar204._12_4_ = iVar56;
              _local_2a8 = vmovlhps_avx(auVar216,auVar204);
              auVar217._4_4_ = iVar55;
              auVar217._0_4_ = iVar55;
              auVar217._8_4_ = iVar55;
              auVar217._12_4_ = iVar55;
              auVar228._0_4_ = (float)(undefined4)uVar54 * (float)(undefined4)uVar54;
              auVar228._4_4_ = (float)uVar54._4_4_ * (float)uVar54._4_4_;
              auVar228._8_8_ = 0;
              auVar72 = vmovshdup_avx(auVar228);
              auVar72 = vfmadd231ss_fma(auVar72,auVar209,auVar209);
              auVar210._0_8_ = uVar54 ^ 0x8000000080000000;
              auVar210._8_4_ = 0x80000000;
              auVar210._12_4_ = 0x80000000;
              auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
              auVar72 = vsqrtss_avx(auVar72,auVar72);
              local_220 = vmovlhps_avx(auVar109._0_16_,auVar158._0_16_);
              local_298[2].high = auVar72._0_4_;
              auVar229._4_4_ = local_298[2].high;
              auVar229._0_4_ = local_298[2].high;
              auVar229._8_4_ = local_298[2].high;
              auVar229._12_4_ = local_298[2].high;
              local_298[2].high = -fVar78 / local_298[2].high;
              auVar72 = vdivps_avx(auVar210,auVar229);
              local_298._24_16_ = ZEXT416(0) << 0x20;
              local_230 = local_3b8;
              local_210 = true;
              local_298[0] = (Interval<float>)vmovlps_avx(auVar217);
              local_298._12_8_ = vmovlps_avx(auVar72);
              local_298[6].low = 0.0;
              local_298[6].high = 0.0;
              local_298[7].low = (float)local_338._0_4_;
              local_298[7].high = (float)local_338._4_4_;
              local_298[8].low = (float)local_1b8._0_4_;
              local_298[8].high = (float)local_1b8._4_4_;
              fStack_24c = local_418[1] * (float)local_1d8._4_4_;
              local_250 = local_418[0] * (float)local_1d8._0_4_;
              fStack_248 = local_418[2] * fStack_1d0;
              fStack_244 = local_418[3] * fStack_1cc;
              local_208.values.values = (array<float,_4>)(array<float,_4>)local_438.values;
              local_338 = auVar131;
              local_1b8 = auVar132;
              bVar70 = Li::anon_class_72_9_b858679e::operator()
                                 ((anon_class_72_9_b858679e *)local_2f0,(MediumSample *)local_2a8);
              this_04 = local_1f0;
              if (!bVar70) goto LAB_00446a00;
              uVar51 = uVar52 * 0x5851f42d4c957f2d + (long)local_3a8;
              uVar50 = (uint)(uVar52 >> 0x2d) ^ (uint)(uVar52 >> 0x1b);
              bVar53 = (byte)(uVar52 >> 0x3b);
              auVar72 = vcvtusi2ss_avx512f(auVar249._0_16_,
                                           uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
              auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),
                                   ZEXT416(0x3f7fffff));
              local_418[0] = auVar72._0_4_;
              fVar78 = expf(((float)local_318._0_4_ - (float)local_448._0_4_) *
                            (float)local_178._0_4_);
              auVar232 = ZEXT464((uint)local_448._0_4_);
              fVar78 = 1.0 - fVar78;
              uVar52 = uVar51;
            } while (local_418[0] < fVar78);
          }
          auVar232 = ZEXT1664(local_168);
          auVar72 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)((local_418[0] - fVar78) / (1.0 - fVar78))));
          in_ZMM4 = ZEXT1664(auVar72);
          fVar130 = (float)local_318._0_4_;
          fVar78 = local_45c;
        }
        this_04 = local_1f0;
        if ((fVar78 < fVar130) ||
           (iVar55 = local_424[lVar60], iVar56 = local_370[lVar60 + 3],
           local_424[lVar60] = iVar55 + iVar56, this_04 = local_1f0,
           iVar55 + iVar56 == local_370[lVar60])) break;
        aVar145.values = (float  [4])ZEXT416((uint)fVar130);
        (&local_3d8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar60] =
             fVar130 + *(float *)((long)&local_408 + lVar60 * 4);
      }
      goto LAB_00446a00;
    }
    local_2f0._8_8_ = &local_308;
    local_2f0._24_8_ = &local_45e;
    local_2f0._0_8_ = local_378;
    local_2f0._16_8_ = local_358;
    local_2d0 = &local_3bc;
    local_2c0 = &local_1c8;
    local_2c8 = local_380;
    local_2b0 = &local_45d;
    uVar1 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    local_418[1] = (float)uVar7;
    local_418[0] = (float)uVar1;
    local_418[2] = 0.0;
    local_418[3] = 0.0;
    local_338._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_44c = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    local_45c = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    local_318._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    iVar55 = this_02[3].lambda_min;
    local_3a8._4_4_ = iVar55;
    local_3a8._0_4_ = iVar55;
    fStack_3a0 = (float)iVar55;
    fStack_39c = (float)iVar55;
    auVar129 = ZEXT856(local_3a8._8_8_);
    SVar251 = DenselySampledSpectrum::Sample(this_02,local_358);
    auVar152._0_8_ = SVar251.values.values._8_8_;
    auVar152._8_56_ = auVar170;
    auVar100._0_8_ = SVar251.values.values._0_8_;
    auVar100._8_56_ = auVar129;
    auVar72 = vpunpcklqdq_avx(auVar100._0_16_,auVar152._0_16_);
    local_3a8._4_4_ = auVar72._4_4_ * (float)local_3a8._4_4_;
    local_3a8._0_4_ = auVar72._0_4_ * (float)local_3a8._0_4_;
    fStack_3a0 = auVar72._8_4_ * fStack_3a0;
    fStack_39c = auVar72._12_4_ * fStack_39c;
    fVar78 = (float)this_02[3].lambda_min;
    local_438.values[1] = fVar78;
    local_438.values[0] = fVar78;
    local_438.values[2] = fVar78;
    local_438.values[3] = fVar78;
    auVar129 = ZEXT856(local_438.values._8_8_);
    SVar251 = DenselySampledSpectrum::Sample(this_02 + 1,pSVar49);
    auVar153._0_8_ = SVar251.values.values._8_8_;
    auVar153._8_56_ = auVar170;
    auVar101._0_8_ = SVar251.values.values._0_8_;
    auVar101._8_56_ = auVar129;
    auVar72 = vpunpcklqdq_avx(auVar101._0_16_,auVar153._0_16_);
    auVar188._0_4_ = auVar72._0_4_ * local_438.values[0];
    auVar188._4_4_ = auVar72._4_4_ * local_438.values[1];
    auVar188._8_4_ = auVar72._8_4_ * local_438.values[2];
    auVar188._12_4_ = auVar72._12_4_ * local_438.values[3];
    afVar137[0] = auVar188._0_4_ + (float)local_3a8._0_4_;
    afVar137[1] = auVar188._4_4_ + (float)local_3a8._4_4_;
    afVar137[2] = auVar188._8_4_ + fStack_3a0;
    afVar137[3] = auVar188._12_4_ + fStack_39c;
    if ((afVar137[0] == 0.0) && (this_04 = local_1f0, !NAN(afVar137[0]))) goto LAB_00446a00;
    uVar50 = local_3b8._4_4_ >> 0xd ^ (uint)((ulong)local_3b8._0_8_ >> 0x1b);
    bVar53 = local_3b8[7] >> 3;
    auVar81._0_4_ = local_418[0] * local_418[0];
    auVar81._4_4_ = local_418[1] * local_418[1];
    auVar81._8_4_ = local_418[2] * local_418[2];
    auVar81._12_4_ = local_418[3] * local_418[3];
    auVar72 = vmovshdup_avx(auVar81);
    auVar72 = vfmadd231ss_fma(auVar72,(undefined1  [16])local_418,(undefined1  [16])local_418);
    auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)local_338._0_4_),ZEXT416((uint)local_338._0_4_))
    ;
    local_398 = vsqrtss_avx(auVar72,auVar72);
    _local_448 = ZEXT416((uint)(local_398._0_4_ * (float)local_448._0_4_));
    auVar72 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar50 >> bVar53 | uVar50 << 0x20 - bVar53);
    auVar72 = vminss_avx(ZEXT416((uint)(auVar72._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    local_438.values = afVar137;
    local_348 = auVar188;
    fVar78 = logf(1.0 - auVar72._0_4_);
    auVar82._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar78) ^ 0x8000000080000000;
    auVar82._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
    auVar82._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
    fVar130 = local_438.values[0];
    auVar199._0_4_ = -fVar78 / fVar130;
    auVar199._4_12_ = auVar82._4_12_;
    in_ZMM4 = ZEXT1664(auVar199);
    if ((float)local_448._0_4_ <= auVar199._0_4_) {
      local_210 = false;
      auVar185._8_4_ = 0x3da1d5b6;
      auVar185._0_8_ = 0x3da1d5b63da1d5b6;
      auVar185._12_4_ = 0x3da1d5b6;
      auVar94._0_4_ = fVar130 * -(float)local_448._0_4_;
      auVar94._4_4_ = local_438.values[1] * -(float)local_448._0_4_;
      auVar94._8_4_ = local_438.values[2] * -(float)local_448._0_4_;
      auVar94._12_4_ = local_438.values[3] * -(float)local_448._0_4_;
      auVar24._8_4_ = 0x3fb8aa3b;
      auVar24._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar24._12_4_ = 0x3fb8aa3b;
      auVar73 = vmulps_avx512vl(auVar94,auVar24);
      auVar72 = vroundps_avx(auVar73,9);
      auVar73 = vsubps_avx(auVar73,auVar72);
      auVar25._8_4_ = 0x3e658299;
      auVar25._0_8_ = 0x3e6582993e658299;
      auVar25._12_4_ = 0x3e658299;
      auVar74 = vfmadd213ps_avx512vl(auVar185,auVar73,auVar25);
      auVar151._0_4_ = (int)auVar72._0_4_;
      auVar151._4_4_ = (int)auVar72._4_4_;
      auVar151._8_4_ = (int)auVar72._8_4_;
      auVar151._12_4_ = (int)auVar72._12_4_;
      auVar26._8_4_ = 0xffffffe1;
      auVar26._0_8_ = 0xffffffe1ffffffe1;
      auVar26._12_4_ = 0xffffffe1;
      uVar51 = vpcmpgtd_avx512vl(auVar151,auVar26);
      uVar51 = uVar51 & 0xf;
      auVar27._8_4_ = 0x1e;
      auVar27._0_8_ = 0x1e0000001e;
      auVar27._12_4_ = 0x1e;
      uVar52 = vpcmpgtd_avx512vl(auVar151,auVar27);
      uVar52 = uVar52 & 0xf;
      auVar28._8_4_ = 0x3f3263b7;
      auVar28._0_8_ = 0x3f3263b73f3263b7;
      auVar28._12_4_ = 0x3f3263b7;
      auVar72 = vfmadd213ps_avx512vl(auVar74,auVar73,auVar28);
      auVar29._8_4_ = 0x3f7ff3bf;
      auVar29._0_8_ = 0x3f7ff3bf3f7ff3bf;
      auVar29._12_4_ = 0x3f7ff3bf;
      auVar72 = vfmadd213ps_avx512vl(auVar72,auVar73,auVar29);
      auVar73 = vpslld_avx(auVar151,0x17);
      auVar72 = vpaddd_avx(auVar73,auVar72);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      bVar70 = (bool)((byte)uVar52 & 1);
      local_208.values.values[0] =
           (float)((uint)bVar70 * auVar73._0_4_ |
                  (uint)!bVar70 * (uint)((byte)uVar51 & 1) * auVar72._0_4_);
      bVar70 = (bool)((byte)(uVar52 >> 1) & 1);
      local_208.values.values[1] =
           (float)((uint)bVar70 * auVar73._4_4_ |
                  (uint)!bVar70 * (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_);
      bVar70 = (bool)((byte)(uVar52 >> 2) & 1);
      local_208.values.values[2] =
           (float)((uint)bVar70 * auVar73._8_4_ |
                  (uint)!bVar70 * (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_);
      bVar70 = SUB81(uVar52 >> 3,0);
      local_208.values.values[3] =
           (float)((uint)bVar70 * auVar73._12_4_ |
                  (uint)!bVar70 * (uint)(byte)(uVar51 >> 3) * auVar72._12_4_);
    }
    else {
      _local_448 = vpermilpd_avx(_local_3a8,1);
      auVar83._4_4_ = local_398._0_4_;
      auVar83._0_4_ = local_398._0_4_;
      auVar83._8_4_ = local_398._0_4_;
      auVar83._12_4_ = local_398._0_4_;
      local_328 = vdivps_avx((undefined1  [16])local_418,auVar83);
      local_338._0_4_ = (float)local_338._0_4_ / (float)local_398._0_4_;
      local_338._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_3b8 = vshufpd_avx((undefined1  [16])local_438.values,(undefined1  [16])local_438.values,
                              1);
      auVar173._8_4_ = 0x3da1d5b6;
      auVar173._0_8_ = 0x3da1d5b63da1d5b6;
      auVar173._12_4_ = 0x3da1d5b6;
      auVar84._0_4_ = fVar130 * -auVar199._0_4_;
      auVar84._4_4_ = local_438.values[1] * -auVar199._0_4_;
      auVar84._8_4_ = local_438.values[2] * -auVar199._0_4_;
      auVar84._12_4_ = local_438.values[3] * -auVar199._0_4_;
      auVar18._8_4_ = 0x3fb8aa3b;
      auVar18._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar18._12_4_ = 0x3fb8aa3b;
      auVar73 = vmulps_avx512vl(auVar84,auVar18);
      auVar72 = vroundps_avx(auVar73,9);
      auVar73 = vsubps_avx(auVar73,auVar72);
      auVar19._8_4_ = 0x3e658299;
      auVar19._0_8_ = 0x3e6582993e658299;
      auVar19._12_4_ = 0x3e658299;
      auVar74 = vfmadd213ps_avx512vl(auVar173,auVar73,auVar19);
      auVar138._0_4_ = (int)auVar72._0_4_;
      auVar138._4_4_ = (int)auVar72._4_4_;
      auVar138._8_4_ = (int)auVar72._8_4_;
      auVar138._12_4_ = (int)auVar72._12_4_;
      auVar129 = ZEXT856(auVar138._8_8_);
      auVar20._8_4_ = 0xffffffe1;
      auVar20._0_8_ = 0xffffffe1ffffffe1;
      auVar20._12_4_ = 0xffffffe1;
      uVar51 = vpcmpgtd_avx512vl(auVar138,auVar20);
      uVar51 = uVar51 & 0xf;
      auVar21._8_4_ = 0x1e;
      auVar21._0_8_ = 0x1e0000001e;
      auVar21._12_4_ = 0x1e;
      uVar52 = vpcmpgtd_avx512vl(auVar138,auVar21);
      uVar52 = uVar52 & 0xf;
      auVar22._8_4_ = 0x3f3263b7;
      auVar22._0_8_ = 0x3f3263b73f3263b7;
      auVar22._12_4_ = 0x3f3263b7;
      auVar72 = vfmadd213ps_avx512vl(auVar74,auVar73,auVar22);
      auVar23._8_4_ = 0x3f7ff3bf;
      auVar23._0_8_ = 0x3f7ff3bf3f7ff3bf;
      auVar23._12_4_ = 0x3f7ff3bf;
      auVar72 = vfmadd213ps_avx512vl(auVar72,auVar73,auVar23);
      auVar73 = vpslld_avx(auVar138,0x17);
      auVar72 = vpaddd_avx(auVar73,auVar72);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      bVar70 = (bool)((byte)uVar52 & 1);
      local_418[0] = (float)((uint)bVar70 * auVar73._0_4_ |
                            (uint)!bVar70 * (uint)((byte)uVar51 & 1) * auVar72._0_4_);
      bVar70 = (bool)((byte)(uVar52 >> 1) & 1);
      local_418[1] = (float)((uint)bVar70 * auVar73._4_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_);
      bVar70 = (bool)((byte)(uVar52 >> 2) & 1);
      local_418[2] = (float)((uint)bVar70 * auVar73._8_4_ |
                            (uint)!bVar70 * (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_);
      bVar70 = SUB81(uVar52 >> 3,0);
      local_418[3] = (float)((uint)bVar70 * auVar73._12_4_ |
                            (uint)!bVar70 * (uint)(byte)(uVar51 >> 3) * auVar72._12_4_);
      auVar170 = ZEXT856(local_418._8_8_);
      local_398 = auVar199;
      SVar251 = DenselySampledSpectrum::Sample(this_02 + 2,local_358);
      auVar154._0_8_ = SVar251.values.values._8_8_;
      auVar154._8_56_ = auVar129;
      auVar102._0_8_ = SVar251.values.values._0_8_;
      auVar102._8_56_ = auVar170;
      local_220 = vmovlhps_avx(auVar102._0_16_,auVar154._0_16_);
      local_298[7] = (Interval<float>)&this_02[0x66666666666].values.ptr;
      local_298[8] = (Interval<float>)((ulong)&this_02[3].lambda_max | 0x1000000000000);
      auVar72 = vmovshdup_avx(local_328);
      fVar78 = local_328._0_4_ * (float)local_398._0_4_ + local_44c;
      fVar130 = local_338._0_4_ * (float)local_398._0_4_ + (float)local_318._0_4_;
      fVar195 = auVar72._0_4_ * (float)local_398._0_4_ + local_45c;
      auVar203._0_8_ = local_328._0_8_ ^ 0x8000000080000000;
      auVar203._8_4_ = local_328._8_4_ ^ 0x80000000;
      auVar203._12_4_ = local_328._12_4_ ^ 0x80000000;
      local_298[2].high = -local_338._0_4_;
      local_298[1].low = (ray->super_Ray).time;
      local_298[5].low = 0.0;
      auVar174._4_4_ = fVar78;
      auVar174._0_4_ = fVar78;
      auVar174._8_4_ = fVar78;
      auVar174._12_4_ = fVar78;
      auVar227._4_4_ = fVar130;
      auVar227._0_4_ = fVar130;
      auVar227._8_4_ = fVar130;
      auVar227._12_4_ = fVar130;
      local_298._24_12_ = ZEXT812(0);
      local_298[4].high = 0;
      in_ZMM4 = ZEXT1664(local_298._24_16_);
      auVar189._4_4_ = fVar195;
      auVar189._0_4_ = fVar195;
      auVar189._8_4_ = fVar195;
      auVar189._12_4_ = fVar195;
      _local_240 = local_348;
      local_210 = true;
      _local_2a8 = vmovlhps_avx(auVar174,auVar189);
      local_298[0] = (Interval<float>)vmovlps_avx(auVar227);
      _local_250 = vunpcklpd_avx(_local_3a8,_local_448);
      local_298._12_8_ = vmovlps_avx(auVar203);
      local_298[6].low = 0.0;
      local_298[6].high = 0.0;
      local_230 = vunpcklpd_avx((undefined1  [16])local_438.values,local_3b8);
      local_208.values.values = (array<float,_4>)(array<float,_4>)local_418;
    }
    goto LAB_004469bf;
  }
  goto LAB_00446a00;
LAB_004469ae:
  local_208.values.values[2] = 1.0;
  local_208.values.values[0] = 1.0;
  local_208.values.values[1] = 1.0;
  local_208.values.values[3] = 1.0;
  local_210 = false;
LAB_004469bf:
  Li::anon_class_72_9_b858679e::operator()
            ((anon_class_72_9_b858679e *)local_2f0,(MediumSample *)local_2a8);
  this_04 = local_1f0;
LAB_00446a00:
  pSVar49 = local_358;
  if (local_45e != false) goto LAB_00446dc0;
  if (local_45d == false) {
    if ((byte)local_38 == '\0') {
      pLVar66 = (local_380->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar8 = *(pointer *)
                ((long)&(local_380->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        infiniteLights.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data + 8);
      if (pLVar66 != pLVar8) {
        auVar232 = ZEXT1664(ZEXT816(0) << 0x40);
        do {
          uVar51 = (pLVar66->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar72 = ZEXT816(0) << 0x40;
          auVar73 = ZEXT816(0) << 0x40;
          uVar50 = (uint)(ushort)(uVar51 >> 0x30);
          if (6 < uVar50) {
            uVar50 = uVar50 - 6;
            this_03 = (ImageInfiniteLight *)(uVar51 & 0xffffffffffff);
            if (uVar50 < 2) {
              auVar170 = ZEXT856(0);
              auVar129 = ZEXT856(0);
              SVar251 = UniformInfiniteLight::Le
                                  ((UniformInfiniteLight *)this_03,&ray->super_Ray,pSVar49);
              auVar167._0_8_ = SVar251.values.values._8_8_;
              auVar167._8_56_ = auVar129;
              auVar73 = auVar167._0_16_;
              auVar118._0_8_ = SVar251.values.values._0_8_;
              auVar118._8_56_ = auVar170;
              auVar72 = auVar118._0_16_;
            }
            else if (uVar50 == 2) {
              auVar170 = ZEXT856(0);
              auVar129 = ZEXT856(0);
              SVar251 = ImageInfiniteLight::Le(this_03,&ray->super_Ray,pSVar49);
              auVar168._0_8_ = SVar251.values.values._8_8_;
              auVar168._8_56_ = auVar129;
              auVar73 = auVar168._0_16_;
              auVar119._0_8_ = SVar251.values.values._0_8_;
              auVar119._8_56_ = auVar170;
              auVar72 = auVar119._0_16_;
            }
            else {
              auVar170 = ZEXT856(0);
              auVar129 = ZEXT856(0);
              SVar251 = PortalImageInfiniteLight::Le
                                  ((PortalImageInfiniteLight *)this_03,&ray->super_Ray,pSVar49);
              auVar169._0_8_ = SVar251.values.values._8_8_;
              auVar169._8_56_ = auVar129;
              auVar73 = auVar169._0_16_;
              auVar120._0_8_ = SVar251.values.values._0_8_;
              auVar120._8_56_ = auVar170;
              auVar72 = auVar120._0_16_;
            }
            auVar232 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar73 = vmovlhps_avx(auVar72,auVar73);
          auVar72 = *(undefined1 (*) [16])(pSVar49->pdf).values;
          auVar95._0_4_ = auVar73._0_4_ * local_1c8.values.values[0];
          auVar95._4_4_ = auVar73._4_4_ * local_1c8.values.values[1];
          auVar95._8_4_ = auVar73._8_4_ * local_1c8.values.values[2];
          auVar95._12_4_ = auVar73._12_4_ * local_1c8.values.values[3];
          pLVar66 = pLVar66 + 1;
          uVar51 = vcmpps_avx512vl(auVar72,auVar232._0_16_,4);
          auVar72 = vdivps_avx512vl(auVar95,auVar72);
          local_308.values.values[0] =
               (float)((uint)((byte)uVar51 & 1) * auVar72._0_4_) + local_308.values.values[0];
          local_308.values.values[1] =
               (float)((uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_) + local_308.values.values[1]
          ;
          local_308.values.values[2] =
               (float)((uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_) + local_308.values.values[2]
          ;
          local_308.values.values[3] =
               (float)((uint)((byte)(uVar51 >> 3) & 1) * auVar72._12_4_) +
               local_308.values.values[3];
        } while (pLVar66 != pLVar8);
      }
      goto LAB_00446dc0;
    }
    uVar6._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar6._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar92._0_8_ = uVar6 ^ 0x8000000080000000;
    auVar92._8_4_ = 0x80000000;
    auVar92._12_4_ = 0x80000000;
    auVar150._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar150._4_4_ = 0x80000000;
    auVar150._8_4_ = 0x80000000;
    auVar150._12_4_ = 0x80000000;
    uVar2 = vmovlps_avx(auVar92);
    IStack_2a0.low = auVar150._0_4_;
    local_2a8 = (undefined1  [8])uVar2;
    auVar170 = ZEXT856(auVar92._8_8_);
    auVar129 = ZEXT856(auVar150._8_8_);
    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
    SVar251 = SurfaceInteraction::Le
                        ((SurfaceInteraction *)&local_138.__align,(Vector3f *)local_2a8,local_358);
    auVar166._0_8_ = SVar251.values.values._8_8_;
    auVar166._8_56_ = auVar129;
    auVar117._0_8_ = SVar251.values.values._0_8_;
    auVar117._8_56_ = auVar170;
    auVar72 = vmovlhps_avx(auVar117._0_16_,auVar166._0_16_);
    auVar93._0_4_ = auVar72._0_4_ * local_1c8.values.values[0];
    auVar93._4_4_ = auVar72._4_4_ * local_1c8.values.values[1];
    auVar93._8_4_ = auVar72._8_4_ * local_1c8.values.values[2];
    auVar93._12_4_ = auVar72._12_4_ * local_1c8.values.values[3];
    auVar72 = *(undefined1 (*) [16])(pSVar49->pdf).values;
    uVar51 = vcmpps_avx512vl(auVar72,_DAT_00601010,4);
    auVar72 = vdivps_avx512vl(auVar93,auVar72);
    local_308.values.values[0] =
         (float)((uint)((byte)uVar51 & 1) * auVar72._0_4_) + local_308.values.values[0];
    local_308.values.values[1] =
         (float)((uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_) + local_308.values.values[1];
    local_308.values.values[2] =
         (float)((uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_) + local_308.values.values[2];
    local_308.values.values[3] =
         (float)((uint)((byte)(uVar51 >> 3) & 1) * auVar72._12_4_) + local_308.values.values[3];
    local_140.bits =
         (local_380->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_148 = *local_378;
    SurfaceInteraction::GetBSDF
              ((BSDF *)local_2a8,(SurfaceInteraction *)&local_138.__align,ray,pSVar49,
               (CameraHandle *)&local_140,local_150,(SamplerHandle *)&local_148);
    pIVar67 = local_378;
    if ((_local_2a8 & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0) {
      uVar48._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar48._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      local_358 = (SampledWavelengths *)(uVar48 ^ 0x8000000080000000);
      uStack_350 = 0x80000000;
      uStack_34c = 0x80000000;
      local_2f0._0_8_ = *local_378;
      local_3a8._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_3a8._4_4_ = 0x80000000;
      fStack_3a0 = -0.0;
      fStack_39c = -0.0;
      FVar77 = detail::DispatchSplit<8>::operator()
                         ((DispatchSplit<8> *)&local_3d8,local_2f0,(ulong)local_2f0._0_8_ >> 0x30);
      IVar79 = *pIVar67;
      local_448._0_4_ = FVar77;
      uVar50 = (uint)IVar79.high._2_2_;
      if ((ulong)IVar79 >> 0x30 < 5) {
        if ((ulong)IVar79 < 0x3000000000000) {
          if (uVar50 == 2) {
            auVar121._0_8_ =
                 PaddedSobolSampler::Get2D((PaddedSobolSampler *)((ulong)IVar79 & 0xffffffffffff));
            auVar121._8_56_ = extraout_var_11;
            auVar72 = auVar121._0_16_;
          }
          else {
            auVar125._0_8_ = HaltonSampler::Get2D((HaltonSampler *)((ulong)IVar79 & 0xffffffffffff))
            ;
            auVar125._8_56_ = extraout_var_15;
            auVar72 = auVar125._0_16_;
          }
        }
        else if ((uVar50 & 6) == 2) {
          auVar123._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)IVar79 & 0xffffffffffff))
          ;
          auVar123._8_56_ = extraout_var_13;
          auVar72 = auVar123._0_16_;
        }
        else {
          auVar127._0_8_ = RandomSampler::Get2D((RandomSampler *)((ulong)IVar79 & 0xffffffffffff));
          auVar127._8_56_ = extraout_var_17;
          auVar72 = auVar127._0_16_;
        }
      }
      else {
        uVar50 = uVar50 - 4;
        if (uVar50 < 3) {
          if (uVar50 == 2) {
            auVar122._0_8_ =
                 StratifiedSampler::Get2D((StratifiedSampler *)((ulong)IVar79 & 0xffffffffffff));
            auVar122._8_56_ = extraout_var_12;
            auVar72 = auVar122._0_16_;
          }
          else {
            auVar126._0_8_ = SobolSampler::Get2D((SobolSampler *)((ulong)IVar79 & 0xffffffffffff));
            auVar126._8_56_ = extraout_var_16;
            auVar72 = auVar126._0_16_;
          }
        }
        else {
          this_01 = (DebugMLTSampler *)((ulong)IVar79 & 0xffffffffffff);
          if ((uVar50 & 0x7ffffffe) == 2) {
            auVar124._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
            auVar124._8_56_ = extraout_var_14;
            auVar72 = auVar124._0_16_;
          }
          else {
            local_438.values[0] = DebugMLTSampler::Get1D(this_01);
            local_438.values[1] = (float)extraout_XMM0_Db;
            local_438.values[2] = (float)extraout_XMM0_Dc;
            local_438.values[3] = extraout_XMM0_Dd;
            auVar128._0_4_ = DebugMLTSampler::Get1D(this_01);
            auVar128._4_60_ = extraout_var_01;
            auVar72 = vinsertps_avx((undefined1  [16])local_438.values,auVar128._0_16_,0x10);
          }
        }
      }
      uVar2 = vmovlps_avx(auVar72);
      local_3d8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar2;
      local_3d8.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)(int)((ulong)uVar2 >> 0x20)
      ;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_3a8._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_358;
      BSDF::Sample_f((BSDFSample *)local_2f0,(BSDF *)local_2a8,woRender,(Float)local_448._0_4_,
                     (Point2f *)&local_3d8,Radiance,All);
      if (0.0 < (float)local_2f0._28_4_) {
        ErrorExit<>("SimpleVolPathIntegrator doesn\'t support scattering from surfaces");
      }
LAB_00446dc0:
      aVar145.values[1] = local_308.values.values[1];
      aVar145.values[0] = local_308.values.values[0];
      aVar145.values[2] = local_308.values.values[2];
      aVar145.values[3] = local_308.values.values[3];
      return (array<float,_4>)(array<float,_4>)aVar145.values;
    }
    if ((byte)local_38 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    SurfaceInteraction::SkipIntersection
              ((SurfaceInteraction *)&local_138.__align,ray,(Float)local_138._248_4_);
  }
  goto LAB_004439f6;
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            ScratchBuffer &scratchBuffer,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    lambda.TerminateSecondary();
    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering for _SimpleVolPathIntegrator_
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(ray, tMax, rng, lambda, [&](const MediumSample &ms) {
                // Update delta-tracking estimator for path sample
                if (!ms.intr)
                    return false;
                const MediumInteraction &intr = *ms.intr;
                const SampledSpectrum &sigma_a = intr.sigma_a, &sigma_s = intr.sigma_s;
                // Compute medium event probabilities for interaction
                Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta-tracking
                Float u = sampler.Get1D();
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, u);
                if (mode == 0) {
                    // Handle absorption event for delta-tracking
                    // absorbed; done
                    L += SafeDiv(intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle scattering event for delta-tracking
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }
                    Vector3f wi = SampleUniformSphere(sampler.Get2D());
                    beta *= intr.phase.p(-ray.d, wi) / UniformSpherePDF();
                    ray = intr.SpawnRay(wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta-tracking
                    // null -- keep going...
                    return true;
                }
            });
        }
        if (terminated)
            break;
        if (!scattered) {
            // Add emission to un-scattered ray
            if (!si) {
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
                return L;
            }
            SurfaceInteraction &isect = si->intr;
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

            // Handle surface intersection for _SimpleVolPathIntegrator_
            BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
            if (!bsdf)
                isect.SkipIntersection(&ray, si->tHit);
            else if (bsdf.Sample_f(-ray.d, sampler.Get1D(), sampler.Get2D()))
                ErrorExit(
                    "SimpleVolPathIntegrator doesn't support scattering from surfaces");
            else
                break;
        }
    }
    return L;
}